

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  short sVar2;
  stbi__uint32 b;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [8];
  stbi_uc sVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  stbi__uint32 sVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  stbi__jpeg *psVar16;
  long lVar17;
  ulong uVar18;
  _func_void_void_ptr_int *data_00;
  uchar *data_01;
  void *pvVar19;
  stbi__context *psVar20;
  float *data_02;
  void *__dest;
  stbi_uc *psVar21;
  byte *pbVar22;
  uint uVar23;
  long lVar24;
  undefined1 uVar25;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar26;
  uint uVar27;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *paVar29;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  ulong extraout_RDX_14;
  uint uVar30;
  ulong uVar31;
  int *piVar32;
  stbi__context *psVar33;
  stbi_uc *psVar34;
  stbi_uc *psVar35;
  short *psVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  int iVar40;
  stbi__result_info *ri_00;
  undefined7 uVar41;
  int iVar42;
  code *pcVar43;
  int *piVar44;
  short sVar45;
  ulong uVar46;
  uint uVar47;
  uint uVar48;
  bool bVar49;
  undefined1 auVar50 [16];
  stbi_uc *coutput [4];
  short data [64];
  uint local_518;
  ulong local_508;
  uint local_500;
  ulong local_4f8;
  ulong local_4f0;
  uint local_4e8;
  uint local_4e0;
  stbi__bmp_data local_4a8;
  stbi_uc *local_488;
  int local_47c;
  int *local_478;
  anon_struct_96_18_0d0905d3 *local_470;
  uint local_468;
  uint local_464;
  stbi_uc *local_460;
  long local_458;
  stbi__uint32 local_450;
  uint local_44c;
  int local_448;
  int local_444;
  stbi_uc *local_440;
  undefined1 local_438 [8];
  stbi_uc *local_430;
  _func_int_void_ptr_char_ptr_int *local_428;
  undefined8 local_420;
  int local_418 [250];
  int iVar28;
  
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri_00 = ri;
  psVar16 = (stbi__jpeg *)malloc(0x4888);
  psVar16->s = s;
  psVar16->idct_block_kernel = stbi__idct_simd;
  pcVar43 = stbi__YCbCr_to_RGB_simd;
  psVar16->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar16->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar16->jfif = 0;
  psVar16->app14_color_transform = -1;
  psVar16->marker = 0xff;
  sVar7 = stbi__get_marker(psVar16);
  if (sVar7 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar16);
  if (sVar7 == 0xd8) {
    psVar16 = (stbi__jpeg *)malloc(0x4888);
    psVar16->s = s;
    psVar16->idct_block_kernel = stbi__idct_simd;
    psVar16->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar16->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      paVar1 = psVar16->img_comp;
      lVar17 = 0x46d8;
      do {
        psVar35 = psVar16->huff_dc[0].fast + lVar17 + -8;
        psVar35[0] = '\0';
        psVar35[1] = '\0';
        psVar35[2] = '\0';
        psVar35[3] = '\0';
        psVar35[4] = '\0';
        psVar35[5] = '\0';
        psVar35[6] = '\0';
        psVar35[7] = '\0';
        psVar35[8] = '\0';
        psVar35[9] = '\0';
        psVar35[10] = '\0';
        psVar35[0xb] = '\0';
        psVar35[0xc] = '\0';
        psVar35[0xd] = '\0';
        psVar35[0xe] = '\0';
        psVar35[0xf] = '\0';
        lVar17 = lVar17 + 0x60;
      } while (lVar17 != 0x4858);
      psVar16->restart_interval = 0;
      iVar10 = stbi__decode_jpeg_header(psVar16,0);
      uVar47 = extraout_EDX;
      if (iVar10 != 0) {
        bVar8 = stbi__get_marker(psVar16);
        local_478 = psVar16->huff_ac[0].delta + 9;
        while (bVar8 != 0xda) {
          if (bVar8 == 0xdc) {
            iVar10 = stbi__get16be(psVar16->s);
            sVar11 = stbi__get16be(psVar16->s);
            if (iVar10 != 4) {
              stbi__g_failure_reason = "bad DNL len";
            }
            if (sVar11 != psVar16->s->img_y) {
              stbi__g_failure_reason = "bad DNL height";
            }
          }
          else {
            if (bVar8 == 0xd9) {
              if ((psVar16->progressive != 0) && (0 < psVar16->s->img_n)) {
                lVar17 = 0;
                do {
                  iVar10 = psVar16->img_comp[lVar17].y + 7 >> 3;
                  if (0 < iVar10) {
                    uVar47 = paVar1[lVar17].x + 7 >> 3;
                    iVar42 = 0;
                    do {
                      if (0 < (int)uVar47) {
                        uVar31 = 0;
                        do {
                          psVar36 = paVar1[lVar17].coeff +
                                    (paVar1[lVar17].coeff_w * iVar42 + (int)uVar31) * 0x40;
                          iVar40 = paVar1[lVar17].tq;
                          lVar24 = 0;
                          do {
                            psVar36[lVar24] = psVar36[lVar24] * psVar16->dequant[iVar40][lVar24];
                            lVar24 = lVar24 + 1;
                          } while (lVar24 != 0x40);
                          (*psVar16->idct_block_kernel)
                                    (paVar1[lVar17].data +
                                     uVar31 * 8 + (long)(iVar42 * 8 * paVar1[lVar17].w2),
                                     paVar1[lVar17].w2,psVar36);
                          uVar31 = uVar31 + 1;
                        } while (uVar31 != uVar47);
                      }
                      iVar42 = iVar42 + 1;
                    } while (iVar42 != iVar10);
                  }
                  lVar17 = lVar17 + 1;
                } while (lVar17 < psVar16->s->img_n);
              }
              if (req_comp == 0) {
                req_comp = (uint)(2 < psVar16->s->img_n) * 2 + 1;
              }
              uVar47 = psVar16->s->img_n;
              if (uVar47 == 3) {
                bVar49 = true;
                if (psVar16->rgb != 3) {
                  if (psVar16->app14_color_transform != 0) goto LAB_0012aaf9;
                  bVar49 = psVar16->jfif == 0;
                }
              }
              else {
LAB_0012aaf9:
                bVar49 = false;
              }
              uVar30 = 1;
              if (bVar49) {
                uVar30 = uVar47;
              }
              if (2 < req_comp) {
                uVar30 = uVar47;
              }
              if (uVar47 != 3) {
                uVar30 = uVar47;
              }
              if (0 < (int)uVar30) {
                lVar17 = 0;
                do {
                  psVar20 = psVar16->s;
                  sVar11 = psVar20->img_x;
                  pvVar19 = malloc((ulong)(sVar11 + 3));
                  *(void **)((long)&psVar16->img_comp[0].linebuf + lVar17 * 2) = pvVar19;
                  if (pvVar19 == (void *)0x0) {
                    stbi__free_jpeg_components(psVar16,psVar20->img_n,why);
                    stbi__g_failure_reason = "outofmem";
                  }
                  else {
                    uVar31 = (long)psVar16->img_h_max /
                             (long)*(int *)((long)&psVar16->img_comp[0].h + lVar17 * 2);
                    iVar10 = (int)uVar31;
                    *(int *)((long)&local_420 + lVar17) = iVar10;
                    iVar42 = psVar16->img_v_max /
                             *(int *)((long)&psVar16->img_comp[0].v + lVar17 * 2);
                    *(int *)((long)&local_420 + lVar17 + 4) = iVar42;
                    *(int *)((long)local_418 + lVar17 + 4) = iVar42 >> 1;
                    *(int *)((long)local_418 + lVar17) =
                         (int)((ulong)((sVar11 + iVar10) - 1) / (uVar31 & 0xffffffff));
                    *(undefined4 *)((long)local_418 + lVar17 + 8) = 0;
                    uVar3 = *(undefined8 *)((long)&psVar16->img_comp[0].data + lVar17 * 2);
                    *(undefined8 *)((long)&local_428 + lVar17) = uVar3;
                    *(undefined8 *)((long)&local_430 + lVar17) = uVar3;
                    if ((iVar10 == 1) && (iVar42 == 1)) {
                      *(code **)(local_438 + lVar17) = resample_row_1;
                    }
                    else {
                      if ((iVar10 == 1) && (iVar42 == 2)) {
                        pcVar43 = stbi__resample_row_v_2;
                      }
                      else if ((iVar10 == 2) && (iVar42 == 1)) {
                        pcVar43 = stbi__resample_row_h_2;
                      }
                      else if ((iVar10 == 2) && (iVar42 == 2)) {
                        pcVar43 = psVar16->resample_row_hv_2_kernel;
                      }
                      else {
                        pcVar43 = stbi__resample_row_generic;
                      }
                      *(code **)(local_438 + lVar17) = pcVar43;
                    }
                  }
                  psVar20 = (stbi__context *)0x0;
                  if (pvVar19 == (void *)0x0) goto LAB_0012b37b;
                  lVar17 = lVar17 + 0x30;
                } while ((ulong)uVar30 * 0x30 != lVar17);
              }
              psVar33 = psVar16->s;
              sVar11 = psVar33->img_y;
              psVar20 = (stbi__context *)stbi__malloc_mad3(req_comp,psVar33->img_x,sVar11,1);
              iVar10 = (int)extraout_RDX_12;
              if (psVar20 == (stbi__context *)0x0) {
                stbi__free_jpeg_components(psVar16,psVar33->img_n,iVar10);
                stbi__g_failure_reason = "outofmem";
                psVar20 = (stbi__context *)0x0;
                goto LAB_0012b37b;
              }
              if (sVar11 != 0) {
                iVar42 = 0;
                uVar47 = 0;
                uVar31 = extraout_RDX_12;
                do {
                  sVar11 = psVar33->img_x;
                  if (0 < (int)uVar30) {
                    piVar32 = local_418 + 2;
                    uVar46 = 0;
                    piVar44 = &psVar16->img_comp[0].y;
                    do {
                      iVar10 = piVar32[-1];
                      iVar40 = piVar32[-3];
                      iVar15 = iVar40 >> 1;
                      auVar50 = (**(code **)(piVar32 + -10))
                                          (*(stbi_uc **)(piVar44 + 10),
                                           *(undefined8 *)
                                            ((long)piVar32 +
                                            ((ulong)(iVar15 <= iVar10) << 3 | 0xffffffffffffffe0)),
                                           *(undefined8 *)
                                            ((long)piVar32 +
                                            ((ulong)(iVar10 < iVar15) << 3 | 0xffffffffffffffe0)),
                                           piVar32[-2]);
                      uVar31 = auVar50._8_8_;
                      *(long *)(&local_4a8.bpp + uVar46 * 2) = auVar50._0_8_;
                      piVar32[-1] = iVar10 + 1;
                      if (iVar40 <= iVar10 + 1) {
                        piVar32[-1] = 0;
                        *(long *)(piVar32 + -8) = *(long *)(piVar32 + -6);
                        iVar10 = *piVar32;
                        *piVar32 = iVar10 + 1;
                        if (iVar10 + 1 < *piVar44) {
                          *(long *)(piVar32 + -6) = *(long *)(piVar32 + -6) + (long)piVar44[1];
                        }
                      }
                      uVar46 = uVar46 + 1;
                      piVar44 = piVar44 + 0x18;
                      piVar32 = piVar32 + 0xc;
                    } while (uVar30 != uVar46);
                  }
                  if (req_comp < 3) {
                    psVar33 = psVar16->s;
                    if (bVar49) {
                      if (req_comp == 1) {
                        if (psVar33->img_x != 0) {
                          uVar31 = CONCAT44(local_4a8.mr,local_4a8.hsz);
                          uVar46 = 0;
                          do {
                            bVar8 = *(byte *)(CONCAT44(local_4a8.mb,local_4a8.mg) + uVar46);
                            psVar20->buffer_start[uVar46 + sVar11 * iVar42 + -0x38] =
                                 (stbi_uc)((uint)bVar8 * 2 + ((uint)bVar8 + (uint)bVar8 * 8) * 3 +
                                           (uint)*(byte *)(uVar31 + uVar46) * 0x96 +
                                           (uint)*(byte *)(CONCAT44(local_4a8.offset,local_4a8.bpp)
                                                          + uVar46) * 0x4d >> 8);
                            uVar46 = uVar46 + 1;
                          } while (uVar46 < psVar33->img_x);
                        }
                      }
                      else if (psVar33->img_x != 0) {
                        uVar31 = CONCAT44(local_4a8.mr,local_4a8.hsz);
                        uVar46 = 0;
                        do {
                          bVar8 = *(byte *)(CONCAT44(local_4a8.mb,local_4a8.mg) + uVar46);
                          psVar20->buffer_start[uVar46 * 2 + (ulong)(sVar11 * iVar42) + -0x38] =
                               (stbi_uc)((uint)bVar8 * 2 + ((uint)bVar8 + (uint)bVar8 * 8) * 3 +
                                         (uint)*(byte *)(uVar31 + uVar46) * 0x96 +
                                         (uint)*(byte *)(CONCAT44(local_4a8.offset,local_4a8.bpp) +
                                                        uVar46) * 0x4d >> 8);
                          psVar20->buffer_start[uVar46 * 2 + (ulong)(sVar11 * iVar42) + -0x37] =
                               0xff;
                          uVar46 = uVar46 + 1;
                        } while (uVar46 < psVar33->img_x);
                      }
                    }
                    else if (psVar33->img_n == 4) {
                      if (psVar16->app14_color_transform == 2) {
                        if (psVar33->img_x != 0) {
                          uVar31 = CONCAT44(local_4a8.all_a,local_4a8.ma);
                          psVar35 = psVar20->buffer_start + ((ulong)(sVar11 * iVar42) - 0x37);
                          uVar46 = 0;
                          do {
                            iVar10 = (*(byte *)(CONCAT44(local_4a8.offset,local_4a8.bpp) + uVar46) ^
                                     0xff) * (uint)*(byte *)(uVar31 + uVar46);
                            psVar35[-1] = (char)((iVar10 + 0x80U >> 8) + iVar10 + 0x80 >> 8);
                            *psVar35 = 0xff;
                            uVar46 = uVar46 + 1;
                            psVar35 = psVar35 + (uint)req_comp;
                          } while (uVar46 < psVar33->img_x);
                        }
                      }
                      else {
                        if (psVar16->app14_color_transform != 0) goto LAB_0012b0ab;
                        if (psVar33->img_x != 0) {
                          uVar31 = CONCAT44(local_4a8.offset,local_4a8.bpp);
                          psVar35 = psVar20->buffer_start + ((ulong)(sVar11 * iVar42) - 0x37);
                          uVar46 = 0;
                          do {
                            bVar8 = *(byte *)(CONCAT44(local_4a8.all_a,local_4a8.ma) + uVar46);
                            iVar40 = (uint)*(byte *)(uVar31 + uVar46) * (uint)bVar8;
                            iVar15 = (uint)*(byte *)(CONCAT44(local_4a8.mr,local_4a8.hsz) + uVar46)
                                     * (uint)bVar8;
                            iVar10 = (uint)*(byte *)(CONCAT44(local_4a8.mb,local_4a8.mg) + uVar46) *
                                     (uint)bVar8;
                            psVar35[-1] = (char)((iVar10 + (iVar10 + 0x80U >> 8) + 0x80 >> 8 & 0xff)
                                                 * 0x1d + (iVar15 + (iVar15 + 0x80U >> 8) + 0x80 >>
                                                           8 & 0xff) * 0x96 +
                                                          (iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >>
                                                           8 & 0xff) * 0x4d >> 8);
                            *psVar35 = 0xff;
                            uVar46 = uVar46 + 1;
                            psVar35 = psVar35 + (uint)req_comp;
                          } while (uVar46 < psVar33->img_x);
                        }
                      }
                    }
                    else {
LAB_0012b0ab:
                      uVar26 = psVar33->img_x;
                      uVar31 = (ulong)uVar26;
                      if (req_comp == 1) {
                        if (uVar26 != 0) {
                          uVar31 = 0;
                          do {
                            psVar20->buffer_start[uVar31 + sVar11 * iVar42 + -0x38] =
                                 *(stbi_uc *)(CONCAT44(local_4a8.offset,local_4a8.bpp) + uVar31);
                            uVar31 = uVar31 + 1;
                          } while (uVar31 < psVar33->img_x);
                        }
                      }
                      else if (uVar26 != 0) {
                        uVar31 = 0;
                        do {
                          psVar20->buffer_start[uVar31 * 2 + (ulong)(sVar11 * iVar42) + -0x38] =
                               *(stbi_uc *)(CONCAT44(local_4a8.offset,local_4a8.bpp) + uVar31);
                          psVar20->buffer_start[uVar31 * 2 + (ulong)(sVar11 * iVar42) + -0x37] =
                               0xff;
                          uVar31 = uVar31 + 1;
                        } while (uVar31 < psVar33->img_x);
                      }
                    }
                  }
                  else {
                    psVar35 = (stbi_uc *)CONCAT44(local_4a8.offset,local_4a8.bpp);
                    psVar33 = psVar16->s;
                    if (psVar33->img_n == 3) {
                      if (bVar49) {
                        if (psVar33->img_x != 0) {
                          uVar31 = CONCAT44(local_4a8.mb,local_4a8.mg);
                          psVar34 = psVar20->buffer_start + ((ulong)(sVar11 * iVar42) - 0x35);
                          uVar46 = 0;
                          do {
                            psVar34[-3] = psVar35[uVar46];
                            psVar34[-2] = *(undefined1 *)
                                           (CONCAT44(local_4a8.mr,local_4a8.hsz) + uVar46);
                            psVar34[-1] = *(undefined1 *)(uVar31 + uVar46);
                            *psVar34 = 0xff;
                            uVar46 = uVar46 + 1;
                            psVar34 = psVar34 + (uint)req_comp;
                          } while (uVar46 < psVar33->img_x);
                        }
                      }
                      else {
LAB_0012b120:
                        (*psVar16->YCbCr_to_RGB_kernel)
                                  (psVar20->buffer_start +
                                   ((ulong)(uVar47 * req_comp * sVar11) - 0x38),psVar35,
                                   (stbi_uc *)CONCAT44(local_4a8.mr,local_4a8.hsz),
                                   (stbi_uc *)CONCAT44(local_4a8.mb,local_4a8.mg),psVar33->img_x,
                                   req_comp);
                        uVar31 = extraout_RDX_13;
                      }
                    }
                    else if (psVar33->img_n == 4) {
                      if (psVar16->app14_color_transform == 2) {
                        (*psVar16->YCbCr_to_RGB_kernel)
                                  (psVar20->buffer_start +
                                   ((ulong)(uVar47 * req_comp * sVar11) - 0x38),psVar35,
                                   (stbi_uc *)CONCAT44(local_4a8.mr,local_4a8.hsz),
                                   (stbi_uc *)CONCAT44(local_4a8.mb,local_4a8.mg),psVar33->img_x,
                                   req_comp);
                        psVar33 = psVar16->s;
                        uVar31 = extraout_RDX_14;
                        if (psVar33->img_x != 0) {
                          psVar35 = psVar20->buffer_start + ((ulong)(sVar11 * iVar42) - 0x36);
                          uVar31 = 0;
                          do {
                            bVar8 = *(byte *)(CONCAT44(local_4a8.all_a,local_4a8.ma) + uVar31);
                            iVar10 = (psVar35[-2] ^ 0xff) * (uint)bVar8;
                            psVar35[-2] = (byte)((iVar10 + 0x80U >> 8) + iVar10 + 0x80 >> 8);
                            iVar10 = (psVar35[-1] ^ 0xff) * (uint)bVar8;
                            psVar35[-1] = (byte)((iVar10 + 0x80U >> 8) + iVar10 + 0x80 >> 8);
                            iVar10 = (*psVar35 ^ 0xff) * (uint)bVar8;
                            *psVar35 = (byte)((iVar10 + 0x80U >> 8) + iVar10 + 0x80 >> 8);
                            uVar31 = uVar31 + 1;
                            psVar35 = psVar35 + (uint)req_comp;
                          } while (uVar31 < psVar33->img_x);
                        }
                      }
                      else {
                        if (psVar16->app14_color_transform != 0) goto LAB_0012b120;
                        if (psVar33->img_x != 0) {
                          uVar31 = CONCAT44(local_4a8.mr,local_4a8.hsz);
                          psVar34 = psVar20->buffer_start + ((ulong)(sVar11 * iVar42) - 0x35);
                          uVar46 = 0;
                          do {
                            bVar8 = *(byte *)(CONCAT44(local_4a8.all_a,local_4a8.ma) + uVar46);
                            iVar10 = (uint)psVar35[uVar46] * (uint)bVar8;
                            psVar34[-3] = (char)((iVar10 + 0x80U >> 8) + iVar10 + 0x80 >> 8);
                            iVar10 = (uint)*(byte *)(uVar31 + uVar46) * (uint)bVar8;
                            psVar34[-2] = (char)((iVar10 + 0x80U >> 8) + iVar10 + 0x80 >> 8);
                            iVar10 = (uint)*(byte *)(CONCAT44(local_4a8.mb,local_4a8.mg) + uVar46) *
                                     (uint)bVar8;
                            psVar34[-1] = (char)((iVar10 + 0x80U >> 8) + iVar10 + 0x80 >> 8);
                            *psVar34 = 0xff;
                            uVar46 = uVar46 + 1;
                            psVar34 = psVar34 + (uint)req_comp;
                          } while (uVar46 < psVar33->img_x);
                        }
                      }
                    }
                    else if (psVar33->img_x != 0) {
                      psVar34 = psVar20->buffer_start + ((ulong)(sVar11 * iVar42) - 0x35);
                      uVar46 = 0;
                      do {
                        sVar7 = psVar35[uVar46];
                        psVar34[-1] = sVar7;
                        psVar34[-2] = sVar7;
                        psVar34[-3] = sVar7;
                        *psVar34 = 0xff;
                        uVar46 = uVar46 + 1;
                        uVar31 = (ulong)psVar33->img_x;
                        psVar34 = psVar34 + (uint)req_comp;
                      } while (uVar46 < uVar31);
                    }
                  }
                  iVar10 = (int)uVar31;
                  uVar47 = uVar47 + 1;
                  psVar33 = psVar16->s;
                  iVar42 = iVar42 + req_comp;
                } while (uVar47 < psVar33->img_y);
              }
              stbi__free_jpeg_components(psVar16,psVar33->img_n,iVar10);
              psVar33 = psVar16->s;
              *x = psVar33->img_x;
              *y = psVar33->img_y;
              if (comp != (int *)0x0) {
                *comp = (uint)(2 < psVar33->img_n) * 2 + 1;
              }
              goto LAB_0012b37b;
            }
            iVar10 = stbi__process_marker(psVar16,(uint)bVar8);
            uVar47 = extraout_EDX_00;
            if (iVar10 == 0) goto LAB_0012b36a;
          }
LAB_0012a322:
          bVar8 = stbi__get_marker(psVar16);
        }
        iVar10 = stbi__get16be(psVar16->s);
        psVar20 = psVar16->s;
        pbVar22 = psVar20->img_buffer;
        paVar29 = extraout_RDX;
        if (pbVar22 < psVar20->img_buffer_end) {
LAB_00128f78:
          psVar20->img_buffer = pbVar22 + 1;
          bVar8 = *pbVar22;
        }
        else {
          if (psVar20->read_from_callbacks != 0) {
            psVar35 = psVar20->buffer_start;
            iVar42 = (*(psVar20->io).read)(psVar20->io_user_data,(char *)psVar35,psVar20->buflen);
            if (iVar42 == 0) {
              psVar20->read_from_callbacks = 0;
              psVar20->img_buffer = psVar35;
              psVar20->img_buffer_end = psVar20->buffer_start + 1;
              psVar20->buffer_start[0] = '\0';
            }
            else {
              psVar20->img_buffer = psVar35;
              psVar20->img_buffer_end = psVar35 + iVar42;
            }
            pbVar22 = psVar20->img_buffer;
            paVar29 = extraout_RDX_00;
            goto LAB_00128f78;
          }
          bVar8 = 0;
        }
        psVar16->scan_n = (uint)bVar8;
        if (((byte)(bVar8 - 5) < 0xfc) || (psVar16->s->img_n < (int)(uint)bVar8)) {
          stbi__g_failure_reason = "bad SOS component count";
        }
        else {
          if (iVar10 == (uint)bVar8 * 2 + 6) {
            if (bVar8 != 0) {
              lVar17 = 0;
              do {
                psVar20 = psVar16->s;
                pbVar22 = psVar20->img_buffer;
                if (pbVar22 < psVar20->img_buffer_end) {
LAB_00129033:
                  psVar20->img_buffer = pbVar22 + 1;
                  uVar30 = (uint)*pbVar22;
                }
                else {
                  if (psVar20->read_from_callbacks != 0) {
                    psVar35 = psVar20->buffer_start;
                    iVar10 = (*(psVar20->io).read)
                                       (psVar20->io_user_data,(char *)psVar35,psVar20->buflen);
                    if (iVar10 == 0) {
                      psVar20->read_from_callbacks = 0;
                      psVar20->img_buffer = psVar35;
                      psVar20->img_buffer_end = psVar20->buffer_start + 1;
                      psVar20->buffer_start[0] = '\0';
                    }
                    else {
                      psVar20->img_buffer = psVar35;
                      psVar20->img_buffer_end = psVar35 + iVar10;
                    }
                    pbVar22 = psVar20->img_buffer;
                    goto LAB_00129033;
                  }
                  uVar30 = 0;
                }
                pcVar43 = (code *)psVar16->s;
                pbVar22 = ((stbi__context *)pcVar43)->img_buffer;
                if (pbVar22 < ((stbi__context *)pcVar43)->img_buffer_end) {
LAB_001290c1:
                  ((stbi__context *)pcVar43)->img_buffer = pbVar22 + 1;
                  bVar8 = *pbVar22;
                }
                else {
                  if (((stbi__context *)pcVar43)->read_from_callbacks != 0) {
                    psVar35 = ((stbi__context *)pcVar43)->buffer_start;
                    iVar10 = (*(((stbi__context *)pcVar43)->io).read)
                                       (((stbi__context *)pcVar43)->io_user_data,(char *)psVar35,
                                        ((stbi__context *)pcVar43)->buflen);
                    if (iVar10 == 0) {
                      ((stbi__context *)pcVar43)->read_from_callbacks = 0;
                      ((stbi__context *)pcVar43)->img_buffer = psVar35;
                      ((stbi__context *)pcVar43)->img_buffer_end =
                           ((stbi__context *)pcVar43)->buffer_start + 1;
                      ((stbi__context *)pcVar43)->buffer_start[0] = '\0';
                    }
                    else {
                      ((stbi__context *)pcVar43)->img_buffer = psVar35;
                      ((stbi__context *)pcVar43)->img_buffer_end = psVar35 + iVar10;
                    }
                    pbVar22 = ((stbi__context *)pcVar43)->img_buffer;
                    goto LAB_001290c1;
                  }
                  bVar8 = 0;
                }
                uVar47 = psVar16->s->img_n;
                if ((int)uVar47 < 1) {
                  uVar31 = 0;
                }
                else {
                  uVar31 = 0;
                  paVar29 = paVar1;
                  do {
                    if (paVar29->id == uVar30) goto LAB_001290f5;
                    uVar31 = uVar31 + 1;
                    paVar29 = paVar29 + 1;
                  } while (uVar47 != uVar31);
                  uVar31 = (ulong)uVar47;
                }
LAB_001290f5:
                if ((uint)uVar31 == uVar47) goto LAB_0012b36a;
                uVar46 = uVar31 & 0xffffffff;
                paVar29 = (anon_struct_96_18_0d0905d3 *)(uVar46 * 0x60);
                psVar16->img_comp[uVar46].hd = (uint)(bVar8 >> 4);
                if (0x3f < bVar8) {
                  stbi__g_failure_reason = "bad DC huff";
                  goto LAB_0012b363;
                }
                paVar29 = paVar1 + uVar46;
                paVar29->ha = bVar8 & 0xf;
                if (3 < (bVar8 & 0xf)) {
                  stbi__g_failure_reason = "bad AC huff";
                  goto LAB_0012b363;
                }
                psVar16->order[lVar17] = (uint)uVar31;
                lVar17 = lVar17 + 1;
              } while (lVar17 < psVar16->scan_n);
            }
            psVar20 = psVar16->s;
            pbVar22 = psVar20->img_buffer;
            if (pbVar22 < psVar20->img_buffer_end) {
LAB_001291b5:
              psVar20->img_buffer = pbVar22 + 1;
              uVar47 = (uint)*pbVar22;
            }
            else {
              if (psVar20->read_from_callbacks != 0) {
                psVar35 = psVar20->buffer_start;
                iVar10 = (*(psVar20->io).read)
                                   (psVar20->io_user_data,(char *)psVar35,psVar20->buflen);
                if (iVar10 == 0) {
                  psVar20->read_from_callbacks = 0;
                  psVar20->img_buffer = psVar35;
                  psVar20->img_buffer_end = psVar20->buffer_start + 1;
                  psVar20->buffer_start[0] = '\0';
                }
                else {
                  psVar20->img_buffer = psVar35;
                  psVar20->img_buffer_end = psVar35 + iVar10;
                }
                pbVar22 = psVar20->img_buffer;
                goto LAB_001291b5;
              }
              uVar47 = 0;
            }
            psVar16->spec_start = uVar47;
            psVar20 = psVar16->s;
            pbVar22 = psVar20->img_buffer;
            if (pbVar22 < psVar20->img_buffer_end) {
LAB_00129236:
              psVar20->img_buffer = pbVar22 + 1;
              uVar47 = (uint)*pbVar22;
            }
            else {
              if (psVar20->read_from_callbacks != 0) {
                psVar35 = psVar20->buffer_start;
                iVar10 = (*(psVar20->io).read)
                                   (psVar20->io_user_data,(char *)psVar35,psVar20->buflen);
                if (iVar10 == 0) {
                  psVar20->read_from_callbacks = 0;
                  psVar20->img_buffer = psVar35;
                  psVar20->img_buffer_end = psVar20->buffer_start + 1;
                  psVar20->buffer_start[0] = '\0';
                }
                else {
                  psVar20->img_buffer = psVar35;
                  psVar20->img_buffer_end = psVar35 + iVar10;
                }
                pbVar22 = psVar20->img_buffer;
                goto LAB_00129236;
              }
              uVar47 = 0;
            }
            psVar16->spec_end = uVar47;
            psVar20 = psVar16->s;
            pbVar22 = psVar20->img_buffer;
            if (pbVar22 < psVar20->img_buffer_end) {
LAB_001292b7:
              psVar20->img_buffer = pbVar22 + 1;
              bVar8 = *pbVar22;
            }
            else {
              if (psVar20->read_from_callbacks != 0) {
                psVar35 = psVar20->buffer_start;
                iVar10 = (*(psVar20->io).read)
                                   (psVar20->io_user_data,(char *)psVar35,psVar20->buflen);
                if (iVar10 == 0) {
                  psVar20->read_from_callbacks = 0;
                  psVar20->img_buffer = psVar35;
                  psVar20->img_buffer_end = psVar20->buffer_start + 1;
                  psVar20->buffer_start[0] = '\0';
                }
                else {
                  psVar20->img_buffer = psVar35;
                  psVar20->img_buffer_end = psVar35 + iVar10;
                }
                pbVar22 = psVar20->img_buffer;
                goto LAB_001292b7;
              }
              bVar8 = 0;
            }
            psVar16->succ_high = (uint)(bVar8 >> 4);
            uVar47 = bVar8 & 0xf;
            paVar29 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar47;
            psVar16->succ_low = uVar47;
            iVar10 = psVar16->progressive;
            iVar42 = psVar16->spec_start;
            if (iVar10 == 0) {
              if ((iVar42 != 0) || ((0xf < bVar8 || ((bVar8 & 0xf) != 0)))) {
LAB_0012a66e:
                stbi__g_failure_reason = "bad SOS";
                goto LAB_0012b363;
              }
              psVar16->spec_end = 0x3f;
            }
            else if ((((0x3f < iVar42) || (0x3f < psVar16->spec_end)) ||
                     (psVar16->spec_end < iVar42)) || ((0xdf < bVar8 || (0xd < uVar47))))
            goto LAB_0012a66e;
            iVar42 = psVar16->scan_n;
            uVar31 = (ulong)(uint)psVar16->restart_interval;
            if (psVar16->restart_interval == 0) {
              uVar31 = 0x7fffffff;
            }
            psVar16->code_buffer = 0;
            psVar16->code_bits = 0;
            psVar16->nomore = 0;
            psVar16->img_comp[3].dc_pred = 0;
            psVar16->img_comp[2].dc_pred = 0;
            psVar16->img_comp[1].dc_pred = 0;
            psVar16->img_comp[0].dc_pred = 0;
            psVar16->marker = 0xff;
            uVar47 = (uint)uVar31;
            psVar16->todo = uVar47;
            psVar16->eob_run = 0;
            if (iVar10 == 0) {
              if (iVar42 == 1) {
                iVar42 = psVar16->order[0];
                iVar40 = psVar16->img_comp[iVar42].y + 7 >> 3;
                iVar10 = 1;
                pcVar43 = (code *)local_438;
                if (0 < iVar40) {
                  uVar30 = paVar1[iVar42].x + 7 >> 3;
                  iVar13 = 0;
                  iVar15 = 0;
                  iVar10 = local_518;
                  do {
                    local_518 = iVar10;
                    if (0 < (int)uVar30) {
                      lVar17 = 0;
                      do {
                        iVar14 = stbi__jpeg_decode_block
                                           (psVar16,(short *)local_438,
                                            (stbi__huffman *)
                                            psVar16->huff_dc[paVar1[iVar42].hd].fast,
                                            (stbi__huffman *)
                                            psVar16->huff_ac[paVar1[iVar42].ha].fast,
                                            psVar16->fast_ac[paVar1[iVar42].ha],iVar42,
                                            psVar16->dequant[paVar1[iVar42].tq]);
                        if (iVar14 == 0) {
                          bVar49 = false;
                          iVar10 = 0;
                          uVar31 = extraout_RDX_06;
                        }
                        else {
                          (*psVar16->idct_block_kernel)
                                    (paVar1[iVar42].data + lVar17 + iVar13 * paVar1[iVar42].w2,
                                     paVar1[iVar42].w2,(short *)local_438);
                          iVar14 = psVar16->todo;
                          psVar16->todo = iVar14 + -1;
                          bVar49 = true;
                          uVar31 = extraout_RDX_07;
                          if (iVar14 < 2) {
                            if (psVar16->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar16);
                              uVar31 = extraout_RDX_08;
                            }
                            if ((psVar16->marker & 0xf8) == 0xd0) {
                              psVar16->code_buffer = 0;
                              psVar16->code_bits = 0;
                              psVar16->nomore = 0;
                              psVar16->img_comp[3].dc_pred = 0;
                              psVar16->img_comp[2].dc_pred = 0;
                              psVar16->img_comp[1].dc_pred = 0;
                              psVar16->img_comp[0].dc_pred = 0;
                              psVar16->marker = 0xff;
                              iVar14 = psVar16->restart_interval;
                              uVar31 = 0x7fffffff;
                              if (iVar14 == 0) {
                                iVar14 = 0x7fffffff;
                              }
                              psVar16->todo = iVar14;
                              psVar16->eob_run = 0;
                            }
                            else {
                              iVar10 = 1;
                              bVar49 = false;
                            }
                          }
                        }
                        uVar47 = (uint)uVar31;
                        pcVar43 = (code *)local_438;
                        local_518 = iVar10;
                        if (!bVar49) goto LAB_0012a30f;
                        lVar17 = lVar17 + 8;
                      } while ((ulong)uVar30 * 8 != lVar17);
                    }
                    pcVar43 = (code *)local_438;
                    uVar47 = (uint)uVar31;
                    iVar15 = iVar15 + 1;
                    iVar13 = iVar13 + 8;
                    iVar10 = local_518;
                  } while (iVar15 != iVar40);
                  iVar10 = 1;
                }
              }
              else {
                iVar10 = 1;
                if (0 < psVar16->img_mcu_y) {
                  iVar42 = 0;
                  do {
                    if (0 < psVar16->img_mcu_x) {
                      local_518 = 0;
                      do {
                        if (0 < psVar16->scan_n) {
                          lVar17 = 0;
                          do {
                            iVar10 = psVar16->order[lVar17];
                            pcVar43 = (code *)((long)iVar10 * 0x60);
                            if (0 < psVar16->img_comp[iVar10].v) {
                              pcVar43 = (code *)((long)&((stbi__context *)pcVar43)->img_x +
                                                (long)paVar1);
                              iVar40 = 0;
                              bVar49 = true;
LAB_0012a122:
                              sVar11 = ((stbi__context *)pcVar43)->img_y;
                              if ((int)sVar11 < 1) goto LAB_0012a1dd;
                              iVar15 = 0;
                              while( true ) {
                                iVar13 = ((stbi__context *)pcVar43)->img_n;
                                iVar14 = *(int *)((long)&(((stbi__context *)pcVar43)->io).read + 4);
                                iVar14 = stbi__jpeg_decode_block
                                                   (psVar16,(short *)local_438,
                                                    (stbi__huffman *)
                                                    psVar16->huff_dc
                                                    [*(int *)&(((stbi__context *)pcVar43)->io).read]
                                                    .fast,(stbi__huffman *)
                                                          psVar16->huff_ac[iVar14].fast,
                                                    psVar16->fast_ac[iVar14],iVar10,
                                                    psVar16->dequant
                                                    [((stbi__context *)pcVar43)->img_out_n]);
                                uVar47 = (uint)extraout_RDX_10;
                                if (iVar14 == 0) break;
                                iVar14 = *(int *)((long)&(((stbi__context *)pcVar43)->io).eof + 4);
                                (*psVar16->idct_block_kernel)
                                          ((stbi_uc *)
                                           (*(long *)&((stbi__context *)pcVar43)->
                                                      read_from_callbacks +
                                           (long)(int)((sVar11 * local_518 + iVar15) * 8) +
                                           (long)((iVar13 * iVar42 + iVar40) * iVar14 * 8)),iVar14,
                                           (short *)local_438);
                                iVar15 = iVar15 + 1;
                                sVar11 = ((stbi__context *)pcVar43)->img_y;
                                uVar31 = extraout_RDX_11;
                                if ((int)sVar11 <= iVar15) goto LAB_0012a1dd;
                              }
                              uVar31 = extraout_RDX_10;
                              if (!bVar49) goto LAB_0012a202;
LAB_0012a2f6:
                              iVar10 = 0;
                              goto LAB_0012a30f;
                            }
LAB_0012a202:
                            lVar17 = lVar17 + 1;
                          } while (lVar17 < psVar16->scan_n);
                        }
                        uVar47 = (uint)uVar31;
                        iVar40 = psVar16->todo;
                        psVar16->todo = iVar40 + -1;
                        iVar10 = 1;
                        if (iVar40 < 2) {
                          if (psVar16->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar16);
                            uVar47 = extraout_EDX_02;
                          }
                          if ((psVar16->marker & 0xf8) != 0xd0) goto LAB_0012a30f;
                          psVar16->code_buffer = 0;
                          psVar16->code_bits = 0;
                          psVar16->nomore = 0;
                          psVar16->img_comp[3].dc_pred = 0;
                          psVar16->img_comp[2].dc_pred = 0;
                          psVar16->img_comp[1].dc_pred = 0;
                          psVar16->img_comp[0].dc_pred = 0;
                          psVar16->marker = 0xff;
                          iVar10 = psVar16->restart_interval;
                          uVar31 = 0x7fffffff;
                          if (iVar10 == 0) {
                            iVar10 = 0x7fffffff;
                          }
                          psVar16->todo = iVar10;
                          psVar16->eob_run = 0;
                        }
                        local_518 = local_518 + 1;
                      } while ((int)local_518 < psVar16->img_mcu_x);
                    }
                    uVar47 = (uint)uVar31;
                    iVar10 = 1;
                    iVar42 = iVar42 + 1;
                  } while (iVar42 < psVar16->img_mcu_y);
                }
              }
            }
            else if (iVar42 == 1) {
              local_458 = (long)psVar16->order[0];
              iVar42 = psVar16->img_comp[local_458].y + 7 >> 3;
              iVar10 = 1;
              if (0 < iVar42) {
                paVar29 = paVar1 + local_458;
                iVar15 = psVar16->img_comp[local_458].x + 7 >> 3;
                iVar40 = 0;
                local_470 = paVar29;
                do {
                  if (0 < iVar15) {
                    iVar10 = 0;
                    do {
                      piVar32 = local_478;
                      psVar36 = paVar29->coeff + (paVar29->coeff_w * iVar40 + iVar10) * 0x40;
                      uVar46 = (ulong)psVar16->spec_start;
                      if (uVar46 == 0) {
                        iVar13 = stbi__jpeg_decode_block_prog_dc
                                           (psVar16,psVar36,
                                            (stbi__huffman *)psVar16->huff_dc[paVar29->hd].fast,
                                            (int)local_458);
                        uVar31 = extraout_RDX_02;
                        if (iVar13 != 0) goto LAB_001298e0;
                        bVar49 = false;
                        pcVar43 = (code *)0x0;
                      }
                      else {
                        uVar47 = (uint)pcVar43;
                        lVar17 = (long)paVar29->ha;
                        psVar35 = psVar16->huff_ac[lVar17].fast;
                        local_518 = psVar16->succ_low;
                        iVar13 = psVar16->eob_run;
                        bVar8 = (byte)local_518;
                        if (psVar16->succ_high == 0) {
                          if (iVar13 == 0) {
                            do {
                              if (psVar16->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar16);
                              }
                              sVar45 = psVar16->fast_ac[lVar17][psVar16->code_buffer >> 0x17];
                              uVar30 = (uint)sVar45;
                              iVar13 = (int)uVar46;
                              if (sVar45 == 0) {
                                if (psVar16->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(psVar16);
                                }
                                uVar30 = psVar16->code_buffer;
                                uVar18 = (ulong)uVar30;
                                uVar31 = (ulong)psVar35[uVar30 >> 0x17];
                                if (uVar31 == 0xff) {
                                  lVar24 = 0;
                                  do {
                                    lVar37 = lVar24;
                                    lVar24 = lVar37 + 1;
                                  } while ((uint)piVar32[lVar17 * 0x1a4 + lVar37 + -0x11] <=
                                           uVar30 >> 0x10);
                                  iVar14 = psVar16->code_bits;
                                  if (lVar24 == 8) {
                                    psVar16->code_bits = iVar14 + -0x10;
                                    uVar38 = 0xffffffff;
                                  }
                                  else {
                                    uVar38 = 0xffffffff;
                                    if ((int)(lVar37 + 10) <= iVar14) {
                                      lVar39 = (long)(int)((uVar30 >> (0x17U - (char)lVar24 & 0x1f)
                                                           & stbi__bmask[lVar37 + 10]) +
                                                          piVar32[lVar17 * 0x1a4 + lVar24]);
                                      if ((uVar30 >> (-psVar35[lVar39 + 0x500] & 0x1f) &
                                          stbi__bmask[psVar35[lVar39 + 0x500]]) !=
                                          (uint)*(ushort *)(psVar35 + lVar39 * 2 + 0x200))
                                      goto LAB_0012d275;
                                      uVar30 = uVar30 << ((byte)(lVar37 + 10) & 0x1f);
                                      uVar18 = (ulong)uVar30;
                                      psVar16->code_bits = (iVar14 - (int)lVar24) + -9;
                                      psVar16->code_buffer = uVar30;
                                      uVar38 = (ulong)psVar35[lVar39 + 0x400];
                                    }
                                  }
                                }
                                else {
                                  bVar9 = psVar35[uVar31 + 0x500];
                                  uVar38 = 0xffffffff;
                                  if ((int)(uint)bVar9 <= psVar16->code_bits) {
                                    uVar30 = uVar30 << (bVar9 & 0x1f);
                                    uVar18 = (ulong)uVar30;
                                    psVar16->code_buffer = uVar30;
                                    psVar16->code_bits = psVar16->code_bits - (uint)bVar9;
                                    uVar38 = (ulong)psVar35[uVar31 + 0x400];
                                  }
                                }
                                uVar30 = (uint)uVar38;
                                if ((int)uVar30 < 0) {
                                  stbi__g_failure_reason = "bad huffman code";
                                  iVar13 = 1;
                                  uVar31 = 0;
                                }
                                else {
                                  uVar31 = uVar38 >> 4;
                                  uVar26 = uVar30 & 0xf;
                                  if ((uVar38 & 0xf) == 0) {
                                    if (uVar30 < 0xf0) {
                                      psVar16->eob_run = 1 << ((byte)uVar31 & 0x1f);
                                      if (0xf < uVar30) {
                                        if (psVar16->code_bits < (int)uVar31) {
                                          stbi__grow_buffer_unsafe(psVar16);
                                        }
                                        bVar9 = (byte)uVar31 & 0x1f;
                                        uVar26 = psVar16->code_buffer << bVar9 |
                                                 psVar16->code_buffer >> 0x20 - bVar9;
                                        uVar30 = stbi__bmask[uVar31];
                                        psVar16->code_buffer = ~uVar30 & uVar26;
                                        psVar16->code_bits = psVar16->code_bits - (int)uVar31;
                                        psVar16->eob_run = psVar16->eob_run + (uVar26 & uVar30);
                                      }
                                      psVar16->eob_run = psVar16->eob_run + -1;
                                      iVar13 = 2;
                                      uVar31 = 0;
                                      goto LAB_00129cc0;
                                    }
                                    uVar30 = iVar13 + 0x10;
                                  }
                                  else {
                                    bVar9 = ""[(long)iVar13 + uVar31];
                                    if (psVar16->code_bits < (int)uVar26) {
                                      stbi__grow_buffer_unsafe(psVar16);
                                    }
                                    uVar30 = psVar16->code_buffer;
                                    uVar27 = uVar30 << (sbyte)uVar26 |
                                             uVar30 >> 0x20 - (sbyte)uVar26;
                                    uVar12 = *(uint *)((long)stbi__bmask + (ulong)(uVar26 * 4));
                                    psVar16->code_buffer = ~uVar12 & uVar27;
                                    psVar16->code_bits = psVar16->code_bits - uVar26;
                                    iVar14 = 0;
                                    if (-1 < (int)uVar30) {
                                      iVar14 = *(int *)((long)stbi__jbias + (ulong)(uVar26 * 4));
                                    }
                                    uVar26 = (uVar27 & uVar12) + iVar14 << (bVar8 & 0x1f);
                                    uVar18 = (ulong)uVar26;
                                    uVar30 = (int)((long)iVar13 + uVar31) + 1;
                                    psVar36[bVar9] = (short)uVar26;
                                  }
                                  iVar13 = 0;
                                  uVar46 = (ulong)uVar30;
                                  uVar31 = CONCAT71((int7)(uVar18 >> 8),1);
                                }
                              }
                              else {
                                psVar16->code_buffer = psVar16->code_buffer << (sbyte)(uVar30 & 0xf)
                                ;
                                psVar16->code_bits = psVar16->code_bits - (uVar30 & 0xf);
                                lVar24 = (long)iVar13 + (ulong)(uVar30 >> 4 & 0xf);
                                uVar46 = (ulong)((int)lVar24 + 1);
                                psVar36[""[lVar24]] = (short)((uVar30 >> 8) << (bVar8 & 0x1f));
                                iVar13 = 0 << (bVar8 & 0x1f);
                                uVar31 = 1;
                              }
LAB_00129cc0:
                              bVar49 = false;
                              uVar18 = 1;
                              if (iVar13 != 0) {
                                bVar49 = false;
                                if (iVar13 != 2) {
                                  uVar18 = uVar31;
                                  bVar49 = false;
                                }
                                break;
                              }
                            } while ((int)uVar46 <= psVar16->spec_end);
                          }
                          else {
                            psVar16->eob_run = iVar13 + -1;
                            uVar18 = 0;
                            bVar49 = true;
                          }
                          if ((char)uVar18 != '\0') goto LAB_001298b7;
                        }
                        else {
                          if (iVar13 == 0) {
                            uVar30 = (0x10000 << (bVar8 & 0x1f)) >> 0x10;
                            local_488 = psVar35;
                            do {
                              if (psVar16->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar16);
                              }
                              uVar26 = psVar16->code_buffer;
                              uVar31 = (ulong)uVar26;
                              uVar18 = (ulong)psVar35[uVar26 >> 0x17];
                              if (uVar18 == 0xff) {
                                lVar24 = 0;
                                do {
                                  lVar37 = lVar24;
                                  lVar24 = lVar37 + 1;
                                } while ((uint)piVar32[lVar17 * 0x1a4 + lVar37 + -0x11] <=
                                         uVar26 >> 0x10);
                                iVar13 = psVar16->code_bits;
                                if (lVar24 == 8) {
                                  psVar16->code_bits = iVar13 + -0x10;
                                  uVar38 = 0xffffffff;
                                }
                                else {
                                  uVar38 = 0xffffffff;
                                  if ((int)(lVar37 + 10) <= iVar13) {
                                    lVar39 = (long)(int)((uVar26 >> (0x17U - (char)lVar24 & 0x1f) &
                                                         stbi__bmask[lVar37 + 10]) +
                                                        piVar32[lVar17 * 0x1a4 + lVar24]);
                                    if ((uVar26 >> (-psVar35[lVar39 + 0x500] & 0x1f) &
                                        stbi__bmask[psVar35[lVar39 + 0x500]]) !=
                                        (uint)*(ushort *)(psVar35 + lVar39 * 2 + 0x200)) {
LAB_0012d275:
                                      __assert_fail(
                                                  "(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/stb/stb_image.h"
                                                  ,0x72d,
                                                  "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                                  );
                                    }
                                    uVar26 = uVar26 << ((byte)(lVar37 + 10) & 0x1f);
                                    uVar31 = (ulong)uVar26;
                                    psVar16->code_bits = (iVar13 - (int)lVar24) + -9;
                                    psVar16->code_buffer = uVar26;
                                    uVar38 = (ulong)psVar35[lVar39 + 0x400];
                                  }
                                }
                              }
                              else {
                                bVar9 = psVar35[uVar18 + 0x500];
                                uVar38 = 0xffffffff;
                                if ((int)(uint)bVar9 <= psVar16->code_bits) {
                                  uVar26 = uVar26 << (bVar9 & 0x1f);
                                  uVar31 = (ulong)uVar26;
                                  psVar16->code_buffer = uVar26;
                                  psVar16->code_bits = psVar16->code_bits - (uint)bVar9;
                                  uVar38 = (ulong)psVar35[uVar18 + 0x400];
                                }
                              }
                              uVar26 = (uint)uVar38;
                              if ((int)uVar26 < 0) {
LAB_00129790:
                                stbi__g_failure_reason = "bad huffman code";
                                bVar49 = false;
                              }
                              else {
                                uVar18 = uVar38 >> 4;
                                if ((uVar26 & 0xf) == 1) {
                                  if (psVar16->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar16);
                                    uVar31 = extraout_RDX_03;
                                  }
                                  uVar26 = psVar16->code_buffer;
                                  psVar16->code_buffer = uVar26 * 2;
                                  psVar16->code_bits = psVar16->code_bits + -1;
                                  sVar45 = (short)(((int)~uVar26 >> 0x1f | 1U) << (bVar8 & 0x1f));
                                }
                                else {
                                  if ((uVar38 & 0xf) != 0) goto LAB_00129790;
                                  if (uVar26 < 0xf0) {
                                    psVar16->eob_run = ~(-1 << ((byte)uVar18 & 0x1f));
                                    uVar38 = 0x40;
                                    if (0xf < uVar26) {
                                      if (psVar16->code_bits < (int)uVar18) {
                                        stbi__grow_buffer_unsafe(psVar16);
                                      }
                                      bVar9 = (byte)uVar18 & 0x1f;
                                      uVar12 = psVar16->code_buffer << bVar9 |
                                               psVar16->code_buffer >> 0x20 - bVar9;
                                      uVar26 = stbi__bmask[uVar18];
                                      uVar27 = ~uVar26 & uVar12;
                                      uVar31 = (ulong)uVar27;
                                      psVar16->code_buffer = uVar27;
                                      psVar16->code_bits = psVar16->code_bits - (int)uVar18;
                                      psVar16->eob_run = psVar16->eob_run + (uVar12 & uVar26);
                                    }
                                  }
                                  else {
                                    uVar38 = 0xf;
                                  }
                                  sVar45 = 0;
                                  uVar18 = uVar38;
                                }
                                uVar46 = (ulong)(int)uVar46;
                                do {
                                  if ((long)psVar16->spec_end < (long)uVar46) break;
                                  bVar9 = ""[uVar46];
                                  if (psVar36[bVar9] == 0) {
                                    if ((int)uVar18 == 0) {
                                      psVar36[bVar9] = sVar45;
                                      bVar49 = false;
                                      uVar18 = 0;
                                    }
                                    else {
                                      uVar18 = (ulong)((int)uVar18 - 1);
                                      bVar49 = true;
                                    }
                                  }
                                  else {
                                    if (psVar16->code_bits < 1) {
                                      stbi__grow_buffer_unsafe(psVar16);
                                      uVar31 = extraout_RDX_04;
                                    }
                                    sVar11 = psVar16->code_buffer;
                                    psVar16->code_buffer = sVar11 * 2;
                                    psVar16->code_bits = psVar16->code_bits + -1;
                                    bVar49 = true;
                                    if (((int)sVar11 < 0) &&
                                       (sVar2 = psVar36[bVar9], (uVar30 & (int)sVar2) == 0)) {
                                      uVar26 = uVar30;
                                      if (sVar2 < 1) {
                                        uVar26 = -uVar30;
                                      }
                                      psVar36[bVar9] = sVar2 + (short)uVar26;
                                    }
                                  }
                                  uVar46 = uVar46 + 1;
                                } while (bVar49);
                                bVar49 = true;
                                psVar35 = local_488;
                              }
                              if (!bVar49) {
                                bVar49 = false;
                                goto LAB_001298bc;
                              }
                            } while ((int)uVar46 <= psVar16->spec_end);
                          }
                          else {
                            psVar16->eob_run = iVar13 + -1;
                            if (psVar16->spec_start <= psVar16->spec_end) {
                              uVar30 = (0x10000 << (bVar8 & 0x1f)) >> 0x10;
                              do {
                                bVar8 = ""[uVar46];
                                if (psVar36[bVar8] != 0) {
                                  if (psVar16->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar16);
                                    uVar31 = extraout_RDX_01;
                                  }
                                  sVar11 = psVar16->code_buffer;
                                  psVar16->code_buffer = sVar11 * 2;
                                  psVar16->code_bits = psVar16->code_bits + -1;
                                  if (((int)sVar11 < 0) &&
                                     (sVar45 = psVar36[bVar8], (uVar30 & (int)sVar45) == 0)) {
                                    uVar26 = -uVar30;
                                    if (0 < sVar45) {
                                      uVar26 = uVar30;
                                    }
                                    psVar36[bVar8] = (short)uVar26 + sVar45;
                                  }
                                }
                                bVar49 = (long)uVar46 < (long)psVar16->spec_end;
                                uVar46 = uVar46 + 1;
                              } while (bVar49);
                            }
                          }
LAB_001298b7:
                          bVar49 = true;
                        }
LAB_001298bc:
                        if (!bVar49) {
                          uVar47 = 0;
                        }
                        pcVar43 = (code *)(ulong)uVar47;
                        paVar29 = local_470;
                        if (!bVar49) {
                          bVar49 = false;
                        }
                        else {
LAB_001298e0:
                          iVar13 = psVar16->todo;
                          psVar16->todo = iVar13 + -1;
                          bVar49 = true;
                          if (iVar13 < 2) {
                            if (psVar16->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar16);
                              uVar31 = extraout_RDX_05;
                            }
                            if ((psVar16->marker & 0xf8) == 0xd0) {
                              psVar16->code_buffer = 0;
                              psVar16->code_bits = 0;
                              psVar16->nomore = 0;
                              psVar16->img_comp[3].dc_pred = 0;
                              psVar16->img_comp[2].dc_pred = 0;
                              psVar16->img_comp[1].dc_pred = 0;
                              psVar16->img_comp[0].dc_pred = 0;
                              psVar16->marker = 0xff;
                              iVar13 = psVar16->restart_interval;
                              uVar31 = 0x7fffffff;
                              if (iVar13 == 0) {
                                iVar13 = 0x7fffffff;
                              }
                              psVar16->todo = iVar13;
                              psVar16->eob_run = 0;
                            }
                            else {
                              pcVar43 = (code *)0x1;
                              bVar49 = false;
                            }
                          }
                        }
                      }
                      uVar47 = (uint)uVar31;
                      if (!bVar49) {
                        iVar10 = (int)pcVar43;
                        goto LAB_0012a30f;
                      }
                      iVar10 = iVar10 + 1;
                    } while (iVar10 != iVar15);
                  }
                  uVar47 = (uint)uVar31;
                  iVar10 = 1;
                  iVar40 = iVar40 + 1;
                } while (iVar40 != iVar42);
              }
            }
            else {
              iVar10 = 1;
              if (0 < psVar16->img_mcu_y) {
                iVar42 = 0;
                do {
                  if (0 < psVar16->img_mcu_x) {
                    iVar40 = 0;
                    do {
                      if (0 < psVar16->scan_n) {
                        lVar17 = 0;
                        do {
                          iVar10 = psVar16->order[lVar17];
                          pcVar43 = (code *)((long)iVar10 * 0x60);
                          if (0 < psVar16->img_comp[iVar10].v) {
                            pcVar43 = (code *)((long)&((stbi__context *)pcVar43)->img_x +
                                              (long)paVar1);
                            iVar15 = 0;
                            bVar49 = true;
                            do {
                              sVar11 = ((stbi__context *)pcVar43)->img_y;
                              if (0 < (int)sVar11) {
                                iVar13 = 0;
                                do {
                                  iVar14 = stbi__jpeg_decode_block_prog_dc
                                                     (psVar16,(short *)(*(long *)(((stbi__context *)
                                                                                  pcVar43)->
                                                                                  buffer_start +
                                                                                 0x18) +
                                                                       (long)(int)((sVar11 * iVar40
                                                                                    + iVar13 +
                                                                                   (((stbi__context
                                                                                      *)pcVar43)->
                                                                                    img_n * iVar42 +
                                                                                   iVar15) * *(int *
                                                  )(((stbi__context *)pcVar43)->buffer_start + 0x20)
                                                  ) * 0x40) * 2),
                                                  (stbi__huffman *)
                                                  psVar16->huff_dc
                                                  [*(int *)&(((stbi__context *)pcVar43)->io).read].
                                                  fast,iVar10);
                                  uVar47 = (uint)extraout_RDX_09;
                                  uVar31 = extraout_RDX_09;
                                  if (iVar14 == 0) {
                                    if (!bVar49) goto LAB_00129fcc;
                                    goto LAB_0012a2f6;
                                  }
                                  iVar13 = iVar13 + 1;
                                  sVar11 = ((stbi__context *)pcVar43)->img_y;
                                } while (iVar13 < (int)sVar11);
                              }
                              iVar15 = iVar15 + 1;
                              bVar49 = iVar15 < ((stbi__context *)pcVar43)->img_n;
                            } while (iVar15 < ((stbi__context *)pcVar43)->img_n);
                          }
LAB_00129fcc:
                          lVar17 = lVar17 + 1;
                        } while (lVar17 < psVar16->scan_n);
                      }
                      uVar47 = (uint)uVar31;
                      iVar15 = psVar16->todo;
                      psVar16->todo = iVar15 + -1;
                      iVar10 = 1;
                      if (iVar15 < 2) {
                        if (psVar16->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar16);
                          uVar47 = extraout_EDX_01;
                        }
                        if ((psVar16->marker & 0xf8) != 0xd0) goto LAB_0012a30f;
                        psVar16->code_buffer = 0;
                        psVar16->code_bits = 0;
                        psVar16->nomore = 0;
                        psVar16->img_comp[3].dc_pred = 0;
                        psVar16->img_comp[2].dc_pred = 0;
                        psVar16->img_comp[1].dc_pred = 0;
                        psVar16->img_comp[0].dc_pred = 0;
                        psVar16->marker = 0xff;
                        iVar10 = psVar16->restart_interval;
                        uVar31 = 0x7fffffff;
                        if (iVar10 == 0) {
                          iVar10 = 0x7fffffff;
                        }
                        psVar16->todo = iVar10;
                        psVar16->eob_run = 0;
                      }
                      iVar40 = iVar40 + 1;
                    } while (iVar40 < psVar16->img_mcu_x);
                  }
                  uVar47 = (uint)uVar31;
                  iVar10 = 1;
                  iVar42 = iVar42 + 1;
                } while (iVar42 < psVar16->img_mcu_y);
              }
            }
LAB_0012a30f:
            if (iVar10 != 0) {
              if (psVar16->marker != 0xff) goto LAB_0012a322;
LAB_0012a32f:
              do {
                psVar20 = psVar16->s;
                if ((psVar20->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0012a34b:
                  if (psVar20->img_buffer_end <= psVar20->img_buffer) goto LAB_0012a322;
                }
                else {
                  iVar10 = (*(psVar20->io).eof)(psVar20->io_user_data);
                  if (iVar10 != 0) {
                    if (psVar20->read_from_callbacks != 0) goto LAB_0012a34b;
                    goto LAB_0012a322;
                  }
                }
                psVar20 = psVar16->s;
                psVar35 = psVar20->img_buffer;
                if (psVar20->img_buffer_end <= psVar35) {
                  if (psVar20->read_from_callbacks == 0) goto LAB_0012a32f;
                  psVar35 = psVar20->buffer_start;
                  iVar10 = (*(psVar20->io).read)
                                     (psVar20->io_user_data,(char *)psVar35,psVar20->buflen);
                  if (iVar10 == 0) {
                    psVar20->read_from_callbacks = 0;
                    psVar20->img_buffer = psVar35;
                    psVar20->img_buffer_end = psVar20->buffer_start + 1;
                    psVar20->buffer_start[0] = '\0';
                  }
                  else {
                    psVar20->img_buffer = psVar35;
                    psVar20->img_buffer_end = psVar35 + iVar10;
                  }
                  psVar35 = psVar20->img_buffer;
                }
                psVar20->img_buffer = psVar35 + 1;
              } while (*psVar35 != 0xff);
              psVar20 = psVar16->s;
              psVar35 = psVar20->img_buffer;
              if (psVar35 < psVar20->img_buffer_end) {
LAB_0012a443:
                psVar20->img_buffer = psVar35 + 1;
                sVar7 = *psVar35;
              }
              else {
                if (psVar20->read_from_callbacks != 0) {
                  psVar35 = psVar20->buffer_start;
                  iVar10 = (*(psVar20->io).read)
                                     (psVar20->io_user_data,(char *)psVar35,psVar20->buflen);
                  if (iVar10 == 0) {
                    psVar20->read_from_callbacks = 0;
                    psVar20->img_buffer = psVar35;
                    psVar20->img_buffer_end = psVar20->buffer_start + 1;
                    psVar20->buffer_start[0] = '\0';
                  }
                  else {
                    psVar20->img_buffer = psVar35;
                    psVar20->img_buffer_end = psVar35 + iVar10;
                  }
                  psVar35 = psVar20->img_buffer;
                  goto LAB_0012a443;
                }
                sVar7 = '\0';
              }
              psVar16->marker = sVar7;
              goto LAB_0012a322;
            }
            goto LAB_0012b36a;
          }
          stbi__g_failure_reason = "bad SOS len";
        }
LAB_0012b363:
        uVar47 = (uint)paVar29;
      }
LAB_0012b36a:
      stbi__free_jpeg_components(psVar16,psVar16->s->img_n,uVar47);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
    goto LAB_0012b379;
  }
  iVar10 = stbi__check_png_header(s);
  psVar35 = s->img_buffer_original;
  s->img_buffer = psVar35;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar10 != 0) {
    if (4 < (uint)req_comp) {
      stbi__g_failure_reason = "bad req_comp";
      return (void *)0x0;
    }
    local_438 = (undefined1  [8])s;
    iVar10 = stbi__parse_png_file((stbi__png *)local_438,0,req_comp);
    data_00 = local_420;
    auVar6 = local_438;
    if (iVar10 == 0) {
      data_00 = (_func_void_void_ptr_int *)0x0;
    }
    else {
      iVar10 = 8;
      if (8 < local_418[0]) {
        iVar10 = local_418[0];
      }
      ri->bits_per_channel = iVar10;
      local_420 = (_func_void_void_ptr_int *)0x0;
      if ((req_comp != 0) && (iVar10 = *(int *)((long)local_438 + 0xc), iVar10 != req_comp)) {
        if (local_418[0] < 9) {
          data_00 = (_func_void_void_ptr_int *)
                    stbi__convert_format
                              ((uchar *)data_00,iVar10,req_comp,*(stbi__uint32 *)local_438,
                               *(stbi__uint32 *)((long)local_438 + 4));
        }
        else {
          data_00 = (_func_void_void_ptr_int *)
                    stbi__convert_format16
                              ((stbi__uint16 *)data_00,iVar10,req_comp,*(stbi__uint32 *)local_438,
                               *(stbi__uint32 *)((long)local_438 + 4));
        }
        *(int *)((long)auVar6 + 0xc) = req_comp;
        if (data_00 == (_func_void_void_ptr_int *)0x0) {
          return (void *)0x0;
        }
      }
      *x = *(stbi__uint32 *)local_438;
      *y = *(stbi__uint32 *)((long)local_438 + 4);
      if (comp != (int *)0x0) {
        *comp = *(int *)((long)local_438 + 8);
      }
    }
    free(local_420);
    local_420 = (_func_void_void_ptr_int *)0x0;
    free(local_428);
    local_428 = (_func_int_void_ptr_char_ptr_int *)0x0;
    free(local_430);
    return data_00;
  }
  if (psVar35 < s->img_buffer_original_end) {
LAB_0012a566:
    s->img_buffer = psVar35 + 1;
    bVar49 = true;
    if (*psVar35 == 'B') {
      psVar35 = s->img_buffer;
      if (s->img_buffer_end <= psVar35) {
        if (s->read_from_callbacks == 0) goto LAB_0012a727;
        psVar35 = s->buffer_start;
        iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
        if (iVar10 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar35;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar35;
          s->img_buffer_end = psVar35 + iVar10;
        }
        psVar35 = s->img_buffer;
      }
      s->img_buffer = psVar35 + 1;
      if (*psVar35 == 'M') {
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar47 = stbi__get16le(s);
        iVar10 = stbi__get16le(s);
        uVar47 = iVar10 << 0x10 | uVar47;
        bVar49 = false;
        if ((((0x38 < uVar47) || ((0x100010000001000U >> ((ulong)uVar47 & 0x3f) & 1) == 0)) &&
            (uVar47 != 0x6c)) && (bVar49 = false, uVar47 != 0x7c)) goto LAB_0012a71d;
      }
    }
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar35 = s->buffer_start;
      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
      if (iVar10 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar35;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar35;
        s->img_buffer_end = psVar35 + iVar10;
      }
      psVar35 = s->img_buffer;
      goto LAB_0012a566;
    }
LAB_0012a71d:
    bVar49 = true;
  }
LAB_0012a727:
  psVar35 = s->img_buffer_original;
  s->img_buffer = psVar35;
  s->img_buffer_end = s->img_buffer_original_end;
  if (!bVar49) {
    local_4a8.all_a = 0xff;
    pvVar19 = stbi__bmp_parse_header(s,&local_4a8);
    if (pvVar19 == (void *)0x0) {
      return (void *)0x0;
    }
    local_450 = s->img_y;
    sVar11 = -local_450;
    if (0 < (int)local_450) {
      sVar11 = local_450;
    }
    s->img_y = sVar11;
    if (local_4a8.hsz == 0xc) {
      if (local_4a8.bpp < 0x18) {
        uVar31 = (ulong)(uint)((local_4a8.offset + -0x26) / 3);
      }
      else {
LAB_0012a82a:
        uVar31 = 0;
      }
    }
    else {
      if (0xf < local_4a8.bpp) goto LAB_0012a82a;
      uVar31 = (ulong)(uint)((local_4a8.offset - local_4a8.hsz) + -0xe >> 2);
    }
    local_4e0 = local_4a8.all_a;
    iVar10 = 4 - (uint)(local_4a8.ma == 0);
    s->img_n = iVar10;
    if (2 < req_comp) {
      iVar10 = req_comp;
    }
    b = s->img_x;
    iVar42 = stbi__mad3sizes_valid(iVar10,b,sVar11,0);
    if (iVar42 == 0) {
      stbi__g_failure_reason = "too large";
      return (void *)0x0;
    }
    data_01 = (uchar *)stbi__malloc_mad3(iVar10,b,sVar11,0);
    if (data_01 == (uchar *)0x0) {
      stbi__g_failure_reason = "outofmem";
      return (void *)0x0;
    }
    if (local_4a8.bpp < 0x10) {
      iVar42 = (int)uVar31;
      if (0x100 < iVar42 || iVar42 == 0) {
        free(data_01);
        stbi__g_failure_reason = "invalid";
        return (void *)0x0;
      }
      if (0 < iVar42) {
        psVar35 = s->buffer_start;
        psVar34 = s->buffer_start + 1;
        uVar46 = 0;
        do {
          psVar21 = s->img_buffer;
          if (psVar21 < s->img_buffer_end) {
LAB_0012b425:
            s->img_buffer = psVar21 + 1;
            sVar7 = *psVar21;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar40 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
              if (iVar40 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar35;
                s->img_buffer_end = psVar34;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar35;
                s->img_buffer_end = psVar35 + iVar40;
              }
              psVar21 = s->img_buffer;
              goto LAB_0012b425;
            }
            sVar7 = '\0';
          }
          local_438[uVar46 * 4 + 2] = sVar7;
          psVar21 = s->img_buffer;
          if (psVar21 < s->img_buffer_end) {
LAB_0012b4a7:
            s->img_buffer = psVar21 + 1;
            sVar7 = *psVar21;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar40 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
              if (iVar40 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar35;
                s->img_buffer_end = psVar34;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar35;
                s->img_buffer_end = psVar35 + iVar40;
              }
              psVar21 = s->img_buffer;
              goto LAB_0012b4a7;
            }
            sVar7 = '\0';
          }
          local_438[uVar46 * 4 + 1] = sVar7;
          psVar21 = s->img_buffer;
          if (psVar21 < s->img_buffer_end) {
LAB_0012b529:
            s->img_buffer = psVar21 + 1;
            sVar7 = *psVar21;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar40 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
              if (iVar40 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar35;
                s->img_buffer_end = psVar34;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar35;
                s->img_buffer_end = psVar35 + iVar40;
              }
              psVar21 = s->img_buffer;
              goto LAB_0012b529;
            }
            sVar7 = '\0';
          }
          local_438[uVar46 * 4] = sVar7;
          if (local_4a8.hsz != 0xc) {
            psVar21 = s->img_buffer;
            if (s->img_buffer_end <= psVar21) {
              if (s->read_from_callbacks == 0) goto LAB_0012b5b7;
              iVar40 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
              if (iVar40 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar35;
                s->img_buffer_end = psVar34;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar35;
                s->img_buffer_end = psVar35 + iVar40;
              }
              psVar21 = s->img_buffer;
            }
            s->img_buffer = psVar21 + 1;
          }
LAB_0012b5b7:
          local_438[uVar46 * 4 + 3] = 0xff;
          uVar46 = uVar46 + 1;
        } while (uVar31 != uVar46);
      }
      stbi__skip(s,(iVar42 * (local_4a8.hsz == 0xc | 0xfffffffc) - local_4a8.hsz) + local_4a8.offset
                   + -0xe);
      if (local_4a8.bpp == 8) {
        uVar47 = s->img_x;
      }
      else {
        if (local_4a8.bpp != 4) {
          free(data_01);
          stbi__g_failure_reason = "bad bpp";
          return (void *)0x0;
        }
        uVar47 = s->img_x + 1 >> 1;
      }
      if (0 < (int)s->img_y) {
        local_518 = -uVar47 & 3;
        psVar35 = s->buffer_start;
        uVar31 = 0;
        iVar42 = 0;
        do {
          if (0 < (int)s->img_x) {
            iVar40 = 0;
            do {
              pbVar22 = s->img_buffer;
              if (pbVar22 < s->img_buffer_end) {
LAB_0012bf67:
                s->img_buffer = pbVar22 + 1;
                uVar47 = (uint)*pbVar22;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                  if (iVar15 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar35;
                    s->img_buffer_end = s->buffer_start + 1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar35;
                    s->img_buffer_end = psVar35 + iVar15;
                  }
                  pbVar22 = s->img_buffer;
                  goto LAB_0012bf67;
                }
                uVar47 = 0;
              }
              uVar30 = uVar47 >> 4;
              if (local_4a8.bpp != 4) {
                uVar30 = uVar47;
              }
              uVar46 = (ulong)uVar30;
              uVar47 = uVar47 & 0xf;
              if (local_4a8.bpp != 4) {
                uVar47 = 0;
              }
              lVar17 = (long)(int)uVar31;
              uVar18 = lVar17 + 3;
              data_01[lVar17] = local_438[uVar46 * 4];
              data_01[lVar17 + 1] = local_438[uVar46 * 4 + 1];
              data_01[lVar17 + 2] = local_438[uVar46 * 4 + 2];
              if (iVar10 == 4) {
                data_01[lVar17 + 3] = 0xff;
                uVar18 = (ulong)((int)uVar31 + 4);
              }
              sVar11 = s->img_x;
              if (iVar40 + 1U == sVar11) {
LAB_0012c09f:
                uVar31 = uVar18 & 0xffffffff;
              }
              else {
                if (local_4a8.bpp == 8) {
                  pbVar22 = s->img_buffer;
                  if (s->img_buffer_end <= pbVar22) {
                    if (s->read_from_callbacks == 0) {
                      uVar47 = 0;
                      goto LAB_0012c069;
                    }
                    iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                    if (iVar15 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar35;
                      s->img_buffer_end = s->buffer_start + 1;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar35;
                      s->img_buffer_end = psVar35 + iVar15;
                    }
                    pbVar22 = s->img_buffer;
                  }
                  s->img_buffer = pbVar22 + 1;
                  uVar47 = (uint)*pbVar22;
                }
LAB_0012c069:
                lVar17 = (long)(int)uVar18;
                uVar31 = lVar17 + 3;
                uVar46 = (ulong)uVar47;
                data_01[lVar17] = local_438[uVar46 * 4];
                data_01[lVar17 + 1] = local_438[uVar46 * 4 + 1];
                data_01[lVar17 + 2] = local_438[uVar46 * 4 + 2];
                if (iVar10 == 4) {
                  uVar18 = (ulong)((int)uVar18 + 4);
                  data_01[lVar17 + 3] = 0xff;
                  goto LAB_0012c09f;
                }
              }
            } while ((iVar40 + 1U != sVar11) && (iVar40 = iVar40 + 2, iVar40 < (int)s->img_x));
          }
          stbi__skip(s,local_518);
          iVar42 = iVar42 + 1;
        } while (iVar42 < (int)s->img_y);
      }
      goto LAB_0012c188;
    }
    stbi__skip(s,(local_4a8.offset - local_4a8.hsz) + -0xe);
    if (local_4a8.bpp == 0x18) {
      iVar42 = -3;
LAB_0012b6c0:
      local_44c = iVar42 * s->img_x & 3;
    }
    else {
      local_44c = 0;
      if (local_4a8.bpp == 0x10) {
        iVar42 = -2;
        goto LAB_0012b6c0;
      }
    }
    iVar42 = 0;
    if (local_4a8.bpp == 0x18) {
      uVar31 = 0;
LAB_0012b71e:
      bVar49 = false;
    }
    else {
      uVar41 = (undefined7)((ulong)ri_00 >> 8);
      if (local_4a8.bpp != 0x20) {
        uVar31 = CONCAT71(uVar41,1);
        goto LAB_0012b71e;
      }
      bVar49 = local_4a8.ma == 0xff000000 &&
               (local_4a8.mr == 0xff0000 && (local_4a8.mg == 0xff00 && local_4a8.mb == 0xff));
      uVar31 = CONCAT71(uVar41,local_4a8.ma != 0xff000000 ||
                               (local_4a8.mr != 0xff0000 ||
                               (local_4a8.mg != 0xff00 || local_4a8.mb != 0xff)));
    }
    iVar40 = 0;
    local_488 = (stbi_uc *)((ulong)local_488 & 0xffffffff00000000);
    local_47c = 0;
    uVar26 = 0;
    uVar47 = 0;
    uVar30 = 0;
    local_464 = 0;
    local_468 = (uint)uVar31;
    if ((char)uVar31 == '\0') {
LAB_0012b914:
      bVar4 = true;
      if (0 < (int)s->img_y) {
        local_440 = s->buffer_start;
        local_460 = s->buffer_start + 1;
        local_470 = (anon_struct_96_18_0d0905d3 *)CONCAT44(local_470._4_4_,-iVar42);
        local_478 = (int *)CONCAT44(local_478._4_4_,-iVar40);
        local_458 = CONCAT44(local_458._4_4_,-(int)local_488);
        local_444 = -local_47c;
        iVar13 = 0;
        iVar15 = 0;
        do {
          psVar35 = local_440;
          local_448 = iVar15;
          if ((char)uVar31 == '\0') {
            if (0 < (int)s->img_x) {
              iVar15 = 0;
              do {
                psVar34 = s->img_buffer;
                if (psVar34 < s->img_buffer_end) {
LAB_0012bbb0:
                  s->img_buffer = psVar34 + 1;
                  sVar7 = *psVar34;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                    if (iVar14 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar35;
                      s->img_buffer_end = local_460;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar35;
                      s->img_buffer_end = psVar35 + iVar14;
                    }
                    psVar34 = s->img_buffer;
                    goto LAB_0012bbb0;
                  }
                  sVar7 = '\0';
                }
                data_01[(long)iVar13 + 2] = sVar7;
                psVar34 = s->img_buffer;
                if (psVar34 < s->img_buffer_end) {
LAB_0012bc5c:
                  s->img_buffer = psVar34 + 1;
                  sVar7 = *psVar34;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                    if (iVar14 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar35;
                      s->img_buffer_end = local_460;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar35;
                      s->img_buffer_end = psVar35 + iVar14;
                    }
                    psVar34 = s->img_buffer;
                    goto LAB_0012bc5c;
                  }
                  sVar7 = '\0';
                }
                data_01[(long)iVar13 + 1] = sVar7;
                psVar34 = s->img_buffer;
                if (psVar34 < s->img_buffer_end) {
LAB_0012bd05:
                  s->img_buffer = psVar34 + 1;
                  sVar7 = *psVar34;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                    if (iVar14 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar35;
                      s->img_buffer_end = local_460;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar35;
                      s->img_buffer_end = psVar35 + iVar14;
                    }
                    psVar34 = s->img_buffer;
                    goto LAB_0012bd05;
                  }
                  sVar7 = '\0';
                }
                data_01[iVar13] = sVar7;
                bVar8 = 0xff;
                if (bVar49) {
                  pbVar22 = s->img_buffer;
                  if (s->img_buffer_end <= pbVar22) {
                    if (s->read_from_callbacks == 0) {
                      bVar8 = 0;
                      goto LAB_0012bdc7;
                    }
                    iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                    if (iVar14 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar35;
                      s->img_buffer_end = local_460;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar35;
                      s->img_buffer_end = psVar35 + iVar14;
                    }
                    pbVar22 = s->img_buffer;
                  }
                  s->img_buffer = pbVar22 + 1;
                  bVar8 = *pbVar22;
                }
LAB_0012bdc7:
                iVar14 = iVar13 + 3;
                if (iVar10 == 4) {
                  data_01[(long)iVar13 + 3] = bVar8;
                  iVar14 = iVar13 + 4;
                }
                iVar13 = iVar14;
                local_4e0 = local_4e0 | bVar8;
                iVar15 = iVar15 + 1;
              } while (iVar15 < (int)s->img_x);
            }
          }
          else if (0 < (int)s->img_x) {
            iVar15 = 0;
            do {
              uVar12 = stbi__get16le(s);
              if (local_4a8.bpp != 0x10) {
                iVar14 = stbi__get16le(s);
                uVar12 = uVar12 | iVar14 << 0x10;
              }
              iVar14 = (int)(uVar12 & local_4a8.mr) >> ((byte)iVar42 & 0x1f);
              if (iVar42 < 0) {
                iVar14 = (uVar12 & local_4a8.mr) << ((byte)local_470 & 0x1f);
              }
              uVar27 = uVar26;
              iVar28 = iVar14;
              if (uVar26 < 8) {
                do {
                  iVar28 = iVar28 + (iVar14 >> ((byte)uVar27 & 0x1f));
                  uVar25 = (undefined1)iVar28;
                  uVar27 = uVar27 + uVar26;
                } while (uVar27 < 8);
              }
              else {
                uVar25 = (undefined1)iVar14;
              }
              iVar14 = (int)(uVar12 & local_4a8.mg) >> ((byte)iVar40 & 0x1f);
              if (iVar40 < 0) {
                iVar14 = (uVar12 & local_4a8.mg) << ((byte)local_478 & 0x1f);
              }
              data_01[iVar13] = uVar25;
              uVar27 = uVar47;
              iVar28 = iVar14;
              if (uVar47 < 8) {
                do {
                  iVar28 = iVar28 + (iVar14 >> ((byte)uVar27 & 0x1f));
                  uVar25 = (undefined1)iVar28;
                  uVar27 = uVar27 + uVar47;
                } while (uVar27 < 8);
              }
              else {
                uVar25 = (undefined1)iVar14;
              }
              iVar14 = (int)(uVar12 & local_4a8.mb) >> ((byte)local_488 & 0x1f);
              if ((int)local_488 < 0) {
                iVar14 = (uVar12 & local_4a8.mb) << ((byte)local_458 & 0x1f);
              }
              data_01[(long)iVar13 + 1] = uVar25;
              uVar27 = uVar30;
              iVar28 = iVar14;
              if (uVar30 < 8) {
                do {
                  iVar28 = iVar28 + (iVar14 >> ((byte)uVar27 & 0x1f));
                  uVar25 = (undefined1)iVar28;
                  uVar27 = uVar27 + uVar30;
                } while (uVar27 < 8);
              }
              else {
                uVar25 = (undefined1)iVar14;
              }
              data_01[(long)iVar13 + 2] = uVar25;
              if (local_4a8.ma == 0) {
                uVar12 = 0xff;
              }
              else {
                uVar23 = (uVar12 & local_4a8.ma) << ((byte)local_444 & 0x1f);
                uVar12 = (int)(uVar12 & local_4a8.ma) >> ((byte)local_47c & 0x1f);
                uVar27 = local_464;
                uVar48 = uVar12;
                if (local_47c < 0) {
                  uVar12 = uVar23;
                  uVar48 = uVar23;
                }
                for (; uVar27 < 8; uVar27 = uVar27 + local_464) {
                  uVar12 = uVar12 + ((int)uVar48 >> ((byte)uVar27 & 0x1f));
                }
              }
              iVar14 = iVar13 + 3;
              if (iVar10 == 4) {
                data_01[(long)iVar13 + 3] = (char)uVar12;
                iVar14 = iVar13 + 4;
              }
              iVar13 = iVar14;
              local_4e0 = local_4e0 | uVar12;
              iVar15 = iVar15 + 1;
            } while (iVar15 < (int)s->img_x);
          }
          stbi__skip(s,local_44c);
          iVar15 = local_448 + 1;
          uVar31 = (ulong)local_468;
        } while (iVar15 < (int)s->img_y);
        bVar4 = true;
      }
    }
    else {
      if ((local_4a8.mg != 0 && local_4a8.mr != 0) && local_4a8.mb != 0) {
        iVar42 = stbi__high_bit(local_4a8.mr);
        iVar42 = iVar42 + -7;
        uVar47 = (local_4a8.mr >> 1 & 0x55555555) + (local_4a8.mr & 0x55555555);
        uVar47 = (uVar47 >> 2 & 0x33333333) + (uVar47 & 0x33333333);
        uVar47 = (uVar47 >> 4) + uVar47 & 0xf0f0f0f;
        uVar47 = (uVar47 >> 8) + uVar47;
        uVar26 = (uVar47 >> 0x10) + uVar47 & 0xff;
        iVar40 = stbi__high_bit(local_4a8.mg);
        iVar40 = iVar40 + -7;
        uVar47 = (local_4a8.mg >> 1 & 0x55555555) + (local_4a8.mg & 0x55555555);
        uVar47 = (uVar47 >> 2 & 0x33333333) + (uVar47 & 0x33333333);
        uVar47 = (uVar47 >> 4) + uVar47 & 0xf0f0f0f;
        uVar47 = (uVar47 >> 8) + uVar47;
        uVar47 = (uVar47 >> 0x10) + uVar47 & 0xff;
        iVar15 = stbi__high_bit(local_4a8.mb);
        local_488 = (stbi_uc *)CONCAT44(local_488._4_4_,iVar15 + -7);
        uVar30 = (local_4a8.mb >> 1 & 0x55555555) + (local_4a8.mb & 0x55555555);
        uVar30 = (uVar30 >> 2 & 0x33333333) + (uVar30 & 0x33333333);
        uVar30 = (uVar30 >> 4) + uVar30 & 0xf0f0f0f;
        uVar30 = (uVar30 >> 8) + uVar30;
        uVar30 = (uVar30 >> 0x10) + uVar30 & 0xff;
        local_47c = stbi__high_bit(local_4a8.ma);
        uVar31 = (ulong)local_468;
        local_47c = local_47c + -7;
        uVar12 = (local_4a8.ma >> 1 & 0x55555555) + (local_4a8.ma & 0x55555555);
        uVar12 = (uVar12 >> 2 & 0x33333333) + (uVar12 & 0x33333333);
        uVar12 = (uVar12 >> 4) + uVar12 & 0xf0f0f0f;
        uVar12 = (uVar12 >> 8) + uVar12;
        local_464 = (uVar12 >> 0x10) + uVar12 & 0xff;
        goto LAB_0012b914;
      }
      free(data_01);
      stbi__g_failure_reason = "bad masks";
      bVar4 = false;
    }
    if (!bVar4) {
      return (void *)0x0;
    }
LAB_0012c188:
    if (((iVar10 == 4) && (local_4e0 == 0)) && (iVar42 = s->img_x * s->img_y * 4, -1 < iVar42 + -1))
    {
      lVar17 = (ulong)(iVar42 - 4) + 7;
      do {
        data_01[lVar17 + 0xfffffffffffffffc] = 0xff;
        lVar17 = lVar17 + -4;
      } while (3 < lVar17);
    }
    if (0 < (int)local_450) {
      uVar47 = (int)s->img_y >> 1;
      if (0 < (int)uVar47) {
        uVar26 = s->img_x * iVar10;
        uVar30 = (s->img_y - 1) * uVar26;
        uVar12 = 0;
        uVar31 = 0;
        do {
          if (0 < (int)uVar26) {
            uVar46 = 0;
            do {
              uVar25 = data_01[uVar46 + uVar12];
              data_01[uVar46 + uVar12] = data_01[uVar46 + uVar30];
              data_01[uVar46 + uVar30] = uVar25;
              uVar46 = uVar46 + 1;
            } while (uVar26 != uVar46);
          }
          uVar31 = uVar31 + 1;
          uVar30 = uVar30 - uVar26;
          uVar12 = uVar12 + uVar26;
        } while (uVar31 != uVar47);
      }
    }
    if (((req_comp != 0) && (iVar10 != req_comp)) &&
       (data_01 = stbi__convert_format(data_01,iVar10,req_comp,s->img_x,s->img_y),
       data_01 == (uchar *)0x0)) {
      return (void *)0x0;
    }
    *x = s->img_x;
    *y = s->img_y;
    if (comp != (int *)0x0) {
      *comp = s->img_n;
      return data_01;
    }
    return data_01;
  }
  if (s->img_buffer_original_end <= psVar35) {
    if (s->read_from_callbacks != 0) {
      psVar35 = s->buffer_start;
      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
      if (iVar10 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar35;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar35;
        s->img_buffer_end = psVar35 + iVar10;
      }
      psVar35 = s->img_buffer;
      goto LAB_0012a95f;
    }
LAB_0012c3c5:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_0012c3d5:
    iVar10 = stbi__psd_test(s);
    if (iVar10 != 0) {
      pvVar19 = stbi__psd_load(s,x,y,comp,req_comp,ri,bpc);
      return pvVar19;
    }
    iVar10 = stbi__pic_test(s);
    if (iVar10 != 0) {
      pvVar19 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
      return pvVar19;
    }
    iVar10 = stbi__pnm_test(s);
    if (iVar10 != 0) {
      pvVar19 = stbi__pnm_load(s,x,y,comp,req_comp,ri_00);
      return pvVar19;
    }
    iVar10 = stbi__hdr_test(s);
    if (iVar10 == 0) {
      iVar10 = stbi__tga_test(s);
      if (iVar10 == 0) {
        stbi__g_failure_reason = "unknown image type";
        return (void *)0x0;
      }
      pvVar19 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
      return pvVar19;
    }
    data_02 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
    if (req_comp == 0) {
      req_comp = *comp;
    }
    psVar35 = stbi__hdr_to_ldr(data_02,*x,*y,req_comp);
    return psVar35;
  }
LAB_0012a95f:
  s->img_buffer = psVar35 + 1;
  if (*psVar35 != 'G') goto LAB_0012c3c5;
  psVar35 = s->img_buffer;
  if (s->img_buffer_end <= psVar35) {
    if (s->read_from_callbacks == 0) goto LAB_0012c3c5;
    psVar35 = s->buffer_start;
    iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
    if (iVar10 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar35;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar35;
      s->img_buffer_end = psVar35 + iVar10;
    }
    psVar35 = s->img_buffer;
  }
  s->img_buffer = psVar35 + 1;
  if (*psVar35 != 'I') goto LAB_0012c3c5;
  psVar35 = s->img_buffer;
  if (s->img_buffer_end <= psVar35) {
    if (s->read_from_callbacks == 0) goto LAB_0012c3c5;
    psVar35 = s->buffer_start;
    iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
    if (iVar10 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar35;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar35;
      s->img_buffer_end = psVar35 + iVar10;
    }
    psVar35 = s->img_buffer;
  }
  s->img_buffer = psVar35 + 1;
  if (*psVar35 != 'F') goto LAB_0012c3c5;
  psVar35 = s->img_buffer;
  if (s->img_buffer_end <= psVar35) {
    if (s->read_from_callbacks == 0) goto LAB_0012c3c5;
    psVar35 = s->buffer_start;
    iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
    if (iVar10 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar35;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar35;
      s->img_buffer_end = psVar35 + iVar10;
    }
    psVar35 = s->img_buffer;
  }
  s->img_buffer = psVar35 + 1;
  if (*psVar35 != '8') goto LAB_0012c3c5;
  psVar35 = s->img_buffer;
  if (psVar35 < s->img_buffer_end) {
LAB_0012c35e:
    s->img_buffer = psVar35 + 1;
    sVar7 = *psVar35;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar35 = s->buffer_start;
      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
      if (iVar10 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar35;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar35;
        s->img_buffer_end = psVar35 + iVar10;
      }
      psVar35 = s->img_buffer;
      goto LAB_0012c35e;
    }
    sVar7 = '\0';
  }
  if ((sVar7 != '9') && (sVar7 != '7')) goto LAB_0012c3c5;
  psVar35 = s->img_buffer;
  if (s->img_buffer_end <= psVar35) {
    if (s->read_from_callbacks == 0) goto LAB_0012c3c5;
    psVar35 = s->buffer_start;
    iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
    if (iVar10 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar35;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar35;
      s->img_buffer_end = psVar35 + iVar10;
    }
    psVar35 = s->img_buffer;
  }
  s->img_buffer = psVar35 + 1;
  sVar7 = *psVar35;
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar7 != 'a') goto LAB_0012c3d5;
  psVar16 = (stbi__jpeg *)malloc(0x4860);
  memset(psVar16,0,0x4860);
  if (*(long *)psVar16->huff_dc[0].fast == 0) {
    psVar33 = (stbi__context *)0x0;
    iVar10 = stbi__gif_header(s,(stbi__gif *)psVar16,comp,0);
    if (iVar10 != 0) goto LAB_0012c5d6;
    goto LAB_0012cab2;
  }
LAB_0012c5d6:
  uVar47 = *(uint *)&psVar16->s;
  uVar30 = *(uint *)((long)&psVar16->s + 4);
  if (((int)(uVar30 | uVar47) < 0) ||
     ((uVar30 != 0 &&
      (((int)(0x7fffffff / (ulong)uVar30) < (int)uVar47 || (0x1fffffff < uVar30 * uVar47)))))) {
    stbi__g_failure_reason = "too large";
    goto LAB_0012c674;
  }
  pvVar19 = *(void **)psVar16->huff_dc[0].fast;
  __dest = stbi__malloc_mad3(4,uVar47,uVar30,0);
  *(void **)psVar16->huff_dc[0].fast = __dest;
  if (__dest == (void *)0x0) {
    stbi__g_failure_reason = "outofmem";
    goto LAB_0012caaa;
  }
  switch(*(uint *)(psVar16->huff_dc[0].fast + 0x20) >> 2 & 7) {
  case 0:
    iVar40 = uVar47 * 4;
    iVar15 = uVar30 * iVar40;
    iVar10 = 0;
    iVar42 = 0;
    goto LAB_0012c6e6;
  case 1:
    if (pvVar19 != (void *)0x0) {
      memcpy(__dest,pvVar19,(long)(int)(uVar30 * uVar47 * 4));
    }
    *(void **)(psVar16->huff_dc[0].fast + 8) = pvVar19;
    break;
  case 2:
    if (pvVar19 != (void *)0x0) {
      memcpy(__dest,pvVar19,(long)(int)(uVar30 * uVar47 * 4));
    }
    iVar10 = psVar16->eob_run;
    iVar42 = psVar16->jfif;
    iVar40 = psVar16->app14_color_transform;
    iVar15 = psVar16->rgb;
LAB_0012c6e6:
    stbi__fill_gif_background((stbi__gif *)psVar16,iVar10,iVar42,iVar40,iVar15);
    break;
  case 3:
    if (*(long *)(psVar16->huff_dc[0].fast + 8) != 0) {
      for (iVar10 = psVar16->jfif; iVar10 < psVar16->rgb; iVar10 = iVar10 + *(int *)&psVar16->s * 4)
      {
        lVar17 = (long)psVar16->eob_run + (long)iVar10;
        memcpy((void *)(*(long *)psVar16->huff_dc[0].fast + lVar17),
               (void *)(lVar17 + *(long *)(psVar16->huff_dc[0].fast + 8)),
               (long)psVar16->app14_color_transform - (long)psVar16->eob_run);
      }
    }
  }
  psVar35 = s->buffer_start;
  psVar34 = s->buffer_start + 1;
LAB_0012c6fd:
  psVar21 = s->img_buffer;
  if (psVar21 < s->img_buffer_end) {
LAB_0012c768:
    s->img_buffer = psVar21 + 1;
    sVar7 = *psVar21;
  }
  else {
    if (s->read_from_callbacks != 0) {
      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
      if (iVar10 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar35;
        s->img_buffer_end = psVar34;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar35;
        s->img_buffer_end = psVar35 + iVar10;
      }
      psVar21 = s->img_buffer;
      goto LAB_0012c768;
    }
    sVar7 = '\0';
  }
  if (sVar7 == '!') {
    psVar21 = s->img_buffer;
    if (s->img_buffer_end <= psVar21) {
      if (s->read_from_callbacks == 0) goto LAB_0012c9be;
      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
      if (iVar10 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar35;
        s->img_buffer_end = psVar34;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar35;
        s->img_buffer_end = psVar35 + iVar10;
      }
      psVar21 = s->img_buffer;
    }
    s->img_buffer = psVar21 + 1;
    if (*psVar21 != 0xf9) goto LAB_0012c9be;
    pbVar22 = s->img_buffer;
    if (pbVar22 < s->img_buffer_end) {
LAB_0012c867:
      s->img_buffer = pbVar22 + 1;
      bVar8 = *pbVar22;
    }
    else {
      if (s->read_from_callbacks != 0) {
        iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
        if (iVar10 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar35;
          s->img_buffer_end = psVar34;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar35;
          s->img_buffer_end = psVar35 + iVar10;
        }
        pbVar22 = s->img_buffer;
        goto LAB_0012c867;
      }
      bVar8 = 0;
    }
    if (bVar8 == 4) {
      pbVar22 = s->img_buffer;
      if (pbVar22 < s->img_buffer_end) {
LAB_0012c902:
        s->img_buffer = pbVar22 + 1;
        uVar47 = (uint)*pbVar22;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
          if (iVar10 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar35;
            s->img_buffer_end = psVar34;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar35;
            s->img_buffer_end = psVar35 + iVar10;
          }
          pbVar22 = s->img_buffer;
          goto LAB_0012c902;
        }
        uVar47 = 0;
      }
      *(uint *)(psVar16->huff_dc[0].fast + 0x20) = uVar47;
      iVar10 = stbi__get16le(s);
      *(int *)(psVar16->huff_dc[0].fast + 0x24) = iVar10;
      pbVar22 = s->img_buffer;
      if (pbVar22 < s->img_buffer_end) {
LAB_0012c99a:
        s->img_buffer = pbVar22 + 1;
        uVar47 = (uint)*pbVar22;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
          if (iVar10 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar35;
            s->img_buffer_end = psVar34;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar35;
            s->img_buffer_end = psVar35 + iVar10;
          }
          pbVar22 = s->img_buffer;
          goto LAB_0012c99a;
        }
        uVar47 = 0;
      }
      *(uint *)(psVar16->huff_dc[0].fast + 0x1c) = uVar47;
LAB_0012c9be:
      do {
        pbVar22 = s->img_buffer;
        if (pbVar22 < s->img_buffer_end) {
LAB_0012ca29:
          s->img_buffer = pbVar22 + 1;
          bVar8 = *pbVar22;
        }
        else {
          if (s->read_from_callbacks != 0) {
            iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
            if (iVar10 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar35;
              s->img_buffer_end = psVar34;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar35;
              s->img_buffer_end = psVar35 + iVar10;
            }
            pbVar22 = s->img_buffer;
            goto LAB_0012ca29;
          }
          bVar8 = 0;
        }
        if (bVar8 == 0) goto LAB_0012c6fd;
        stbi__skip(s,(uint)bVar8);
      } while( true );
    }
    stbi__skip(s,(uint)bVar8);
    goto LAB_0012c6fd;
  }
  psVar33 = s;
  if (sVar7 != ';') {
    if (sVar7 == ',') {
      iVar10 = stbi__get16le(s);
      iVar42 = stbi__get16le(s);
      iVar40 = stbi__get16le(s);
      iVar15 = stbi__get16le(s);
      if ((*(int *)&psVar16->s < iVar40 + iVar10) ||
         (*(int *)((long)&psVar16->s + 4) < iVar15 + iVar42)) {
        stbi__g_failure_reason = "bad Image Descriptor";
      }
      else {
        iVar13 = *(int *)&psVar16->s * 4;
        psVar16->order[1] = iVar13;
        psVar16->eob_run = iVar10 << 2;
        psVar16->jfif = iVar42 * iVar13;
        psVar16->app14_color_transform = (iVar40 + iVar10) * 4;
        psVar16->rgb = iVar13 * (iVar15 + iVar42);
        psVar16->scan_n = iVar10 << 2;
        psVar16->order[0] = iVar42 * iVar13;
        pbVar22 = s->img_buffer;
        if (pbVar22 < s->img_buffer_end) {
LAB_0012cc40:
          s->img_buffer = pbVar22 + 1;
          bVar8 = *pbVar22;
        }
        else {
          if (s->read_from_callbacks != 0) {
            iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
            if (iVar10 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar35;
              s->img_buffer_end = psVar34;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar35;
              s->img_buffer_end = psVar35 + iVar10;
            }
            pbVar22 = s->img_buffer;
            goto LAB_0012cc40;
          }
          bVar8 = 0;
        }
        psVar16->succ_low = (uint)bVar8;
        iVar10 = psVar16->order[1] * 8;
        if ((bVar8 & 0x40) == 0) {
          iVar10 = psVar16->order[1];
        }
        psVar16->succ_high = iVar10;
        psVar16->spec_end = (int)((uint)bVar8 << 0x19) >> 0x1f & 3;
        if ((char)bVar8 < '\0') {
          psVar21 = psVar16->huff_dc[0].values + 0x28;
          local_500 = 0xffffffff;
          iVar10 = -1;
          if ((psVar16->huff_dc[0].fast[0x20] & 1) != 0) {
            iVar10 = *(int *)(psVar16->huff_dc[0].fast + 0x1c);
          }
          stbi__gif_parse_colortable(s,(stbi_uc (*) [4])psVar21,2 << (bVar8 & 7),iVar10);
        }
        else {
          if ((psVar16->huff_dc[0].fast[0x10] & 0x80) == 0) {
            stbi__g_failure_reason = "missing color table";
            goto LAB_0012caaa;
          }
          lVar17 = (long)*(int *)(psVar16->huff_dc[0].fast + 0x1c);
          local_500 = 0xffffffff;
          if ((-1 < lVar17) && ((psVar16->huff_dc[0].fast[0x20] & 1) != 0)) {
            local_500 = (uint)psVar16->huff_dc[0].fast[lVar17 * 4 + 0x2b];
            psVar16->huff_dc[0].fast[lVar17 * 4 + 0x2b] = '\0';
          }
          psVar21 = psVar16->huff_dc[0].fast + 0x28;
        }
        *(stbi_uc **)&psVar16->progressive = psVar21;
        pbVar22 = s->img_buffer;
        if (pbVar22 < s->img_buffer_end) {
LAB_0012cd93:
          s->img_buffer = pbVar22 + 1;
          bVar8 = *pbVar22;
        }
        else {
          if (s->read_from_callbacks != 0) {
            iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
            if (iVar10 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar35;
              s->img_buffer_end = psVar34;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar35;
              s->img_buffer_end = psVar35 + iVar10;
            }
            pbVar22 = s->img_buffer;
            goto LAB_0012cd93;
          }
          bVar8 = 0;
        }
        if (bVar8 < 0xd) {
          uVar47 = 1 << (bVar8 & 0x1f);
          uVar31 = 0;
          do {
            psVar16->huff_dc[1].code[uVar31 * 2 + -0x34] = 0xffff;
            *(char *)(psVar16->huff_dc[1].code + uVar31 * 2 + -0x33) = (char)uVar31;
            *(char *)((long)psVar16->huff_dc[1].code + uVar31 * 4 + -0x65) = (char)uVar31;
            uVar31 = uVar31 + 1;
          } while (uVar47 != uVar31);
          local_508 = (ulong)(bVar8 + 1);
          uVar12 = (2 << (bVar8 & 0x1f)) - 1;
          local_478 = (int *)CONCAT44(local_478._4_4_,uVar47 + 1);
          local_488 = (stbi_uc *)CONCAT44(local_488._4_4_,bVar8 + 1);
          local_470 = (anon_struct_96_18_0d0905d3 *)CONCAT44(local_470._4_4_,uVar47 + 2);
          local_4f0 = (ulong)(uVar47 + 2);
          uVar27 = 0;
          iVar10 = 0;
          uVar26 = 0;
          local_4e8 = uVar12;
          bVar49 = true;
          uVar30 = 0xffffffff;
LAB_0012ce48:
          do {
            iVar42 = iVar10 - (int)local_508;
            if ((int)local_508 <= iVar10) {
              bVar8 = (byte)local_508;
              uVar48 = uVar26 & local_4e8;
              bVar4 = true;
              bVar5 = false;
              if (uVar48 == uVar47) {
                local_508 = (ulong)local_488 & 0xffffffff;
                local_4f0 = (ulong)local_470 & 0xffffffff;
                uVar48 = 0xffffffff;
                local_4e8 = uVar12;
              }
              else {
                if (uVar48 == (uint)local_478) {
                  do {
                    stbi__skip(s,uVar27);
                    pbVar22 = s->img_buffer;
                    if (pbVar22 < s->img_buffer_end) {
LAB_0012d08e:
                      s->img_buffer = pbVar22 + 1;
                      bVar9 = *pbVar22;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                        if (iVar10 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar35;
                          s->img_buffer_end = psVar34;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar35;
                          s->img_buffer_end = psVar35 + iVar10;
                        }
                        pbVar22 = s->img_buffer;
                        goto LAB_0012d08e;
                      }
                      bVar9 = 0;
                    }
                    if (bVar9 == 0) goto LAB_0012d0d0;
                    uVar27 = (uint)bVar9;
                  } while( true );
                }
                if ((int)(uint)local_4f0 < (int)uVar48) {
                  stbi__g_failure_reason = "illegal code in raster";
                }
                else if (bVar49) {
                  stbi__g_failure_reason = "no clear code";
                  bVar49 = true;
                }
                else {
                  if ((int)uVar30 < 0) {
                    if (uVar48 != (uint)local_4f0) {
                      local_4f8 = local_4f0;
                      goto LAB_0012d1f4;
                    }
                    stbi__g_failure_reason = "illegal code in raster";
                  }
                  else {
                    uVar23 = (uint)local_4f0 + 1;
                    local_4f8 = (ulong)uVar23;
                    if ((int)(uint)local_4f0 < 0x1000) {
                      lVar17 = (long)(int)(uint)local_4f0;
                      psVar16->huff_dc[1].code[lVar17 * 2 + -0x34] = (stbi__uint16)uVar30;
                      uVar25 = (undefined1)psVar16->huff_dc[1].code[(ulong)uVar30 * 2 + -0x33];
                      *(undefined1 *)(psVar16->huff_dc[1].code + lVar17 * 2 + -0x33) = uVar25;
                      if (uVar48 != uVar23) {
                        uVar25 = (undefined1)psVar16->huff_dc[1].code[(long)(int)uVar48 * 2 + -0x33]
                        ;
                      }
                      *(undefined1 *)((long)psVar16->huff_dc[1].code + lVar17 * 4 + -0x65) = uVar25;
LAB_0012d1f4:
                      stbi__out_gif_code((stbi__gif *)psVar16,(stbi__uint16)uVar48);
                      bVar49 = ((uint)local_4f8 & local_4e8) == 0;
                      uVar30 = (int)local_508 + 1;
                      if ((int)(uint)local_4f8 < 0x1000 && bVar49) {
                        local_508 = (ulong)uVar30;
                      }
                      if ((int)(uint)local_4f8 < 0x1000 && bVar49) {
                        local_4e8 = ~(-1 << ((byte)uVar30 & 0x1f));
                      }
                      local_4f0 = local_4f8;
                      goto LAB_0012d120;
                    }
                    stbi__g_failure_reason = "too many codes";
                    local_4f0 = (ulong)uVar23;
                  }
                  bVar49 = false;
                }
                bVar4 = false;
                psVar33 = (stbi__context *)0x0;
                uVar48 = uVar30;
                bVar5 = bVar49;
              }
              goto LAB_0012d120;
            }
            if (uVar27 == 0) {
              pbVar22 = s->img_buffer;
              if (pbVar22 < s->img_buffer_end) {
LAB_0012ced7:
                s->img_buffer = pbVar22 + 1;
                bVar8 = *pbVar22;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar42 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                  if (iVar42 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar35;
                    s->img_buffer_end = psVar34;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar35;
                    s->img_buffer_end = psVar35 + iVar42;
                  }
                  pbVar22 = s->img_buffer;
                  goto LAB_0012ced7;
                }
                bVar8 = 0;
              }
              if (bVar8 == 0) {
                psVar33 = *(stbi__context **)psVar16->huff_dc[0].fast;
                goto LAB_0012d24f;
              }
              uVar27 = (uint)bVar8;
            }
            pbVar22 = s->img_buffer;
            if (pbVar22 < s->img_buffer_end) {
LAB_0012cf7d:
              s->img_buffer = pbVar22 + 1;
              uVar48 = (uint)*pbVar22;
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar42 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                if (iVar42 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar35;
                  s->img_buffer_end = psVar34;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar35;
                  s->img_buffer_end = psVar35 + iVar42;
                }
                pbVar22 = s->img_buffer;
                goto LAB_0012cf7d;
              }
              uVar48 = 0;
            }
            bVar8 = (byte)iVar10;
            uVar27 = uVar27 - 1;
            iVar10 = iVar10 + 8;
            uVar26 = uVar26 | uVar48 << (bVar8 & 0x1f);
          } while( true );
        }
        psVar33 = (stbi__context *)0x0;
LAB_0012d24f:
        if (psVar33 != (stbi__context *)0x0) {
          if (local_500 != 0xffffffff) {
            psVar16->huff_dc[0].fast[(long)*(int *)(psVar16->huff_dc[0].fast + 0x1c) * 4 + 0x2b] =
                 (stbi_uc)local_500;
          }
          goto LAB_0012cab2;
        }
      }
LAB_0012caaa:
      psVar33 = (stbi__context *)0x0;
    }
    else {
      stbi__g_failure_reason = "unknown code";
LAB_0012c674:
      psVar33 = (stbi__context *)0x0;
    }
  }
LAB_0012cab2:
  psVar20 = (stbi__context *)0x0;
  if (psVar33 != s) {
    psVar20 = psVar33;
  }
  if (psVar20 == (stbi__context *)0x0) {
    pvVar19 = *(void **)psVar16->huff_dc[0].fast;
    if (pvVar19 != (void *)0x0) {
      free(pvVar19);
    }
LAB_0012b379:
    psVar20 = (stbi__context *)0x0;
  }
  else {
    uVar47 = *(uint *)&psVar16->s;
    *x = uVar47;
    uVar30 = *(uint *)((long)&psVar16->s + 4);
    *y = uVar30;
    if ((req_comp & 0xfffffffbU) != 0) {
      psVar20 = (stbi__context *)stbi__convert_format((uchar *)psVar20,4,req_comp,uVar47,uVar30);
    }
  }
LAB_0012b37b:
  free(psVar16);
  return psVar20;
LAB_0012a1dd:
  iVar40 = iVar40 + 1;
  bVar49 = iVar40 < ((stbi__context *)pcVar43)->img_n;
  if (((stbi__context *)pcVar43)->img_n <= iVar40) goto LAB_0012a202;
  goto LAB_0012a122;
LAB_0012d0d0:
  psVar33 = *(stbi__context **)psVar16->huff_dc[0].fast;
  uVar27 = 0;
  bVar4 = false;
  uVar48 = uVar30;
  bVar5 = bVar49;
LAB_0012d120:
  iVar10 = iVar42;
  uVar26 = (int)uVar26 >> (bVar8 & 0x1f);
  bVar49 = bVar5;
  uVar30 = uVar48;
  if (!bVar4) goto LAB_0012d24f;
  goto LAB_0012ce48;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}